

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx::SubGridMBIntersectorKPluecker<4,_8,_true>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  ushort uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  RTCFilterFunctionN p_Var7;
  size_t k;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  ulong uVar79;
  uint uVar80;
  AABBNodeMB4D *node1;
  ulong uVar81;
  long lVar82;
  long lVar83;
  ulong uVar84;
  long lVar85;
  uint uVar86;
  long lVar87;
  int iVar88;
  long lVar89;
  ulong uVar90;
  undefined4 uVar91;
  ulong unaff_RBX;
  ulong *puVar92;
  undefined1 (*pauVar93) [32];
  ulong uVar94;
  Geometry *pGVar95;
  RayK<8> *pRVar96;
  ulong uVar97;
  RayQueryContext *pRVar98;
  long lVar99;
  bool bVar100;
  undefined1 auVar101 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar123 [16];
  float fVar135;
  undefined1 auVar124 [16];
  float fVar133;
  float fVar134;
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [64];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar144 [16];
  float fVar139;
  undefined1 auVar145 [16];
  float fVar156;
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  float fVar155;
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar154 [64];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar164 [16];
  float fVar172;
  float fVar173;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  float fVar174;
  float fVar178;
  float fVar179;
  undefined1 auVar171 [32];
  undefined1 auVar181 [16];
  undefined1 auVar184 [16];
  float fVar180;
  float fVar194;
  float fVar195;
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar196 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar206;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar219;
  float fVar220;
  float fVar230;
  float fVar232;
  float fVar236;
  float fVar238;
  float fVar240;
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  float fVar231;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar237;
  float fVar239;
  float fVar241;
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  float fVar242;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  float fVar253;
  float fVar256;
  float fVar257;
  undefined1 auVar254 [16];
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  undefined1 auVar255 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  float fVar264;
  float fVar265;
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  undefined1 auVar279 [32];
  float fVar286;
  undefined1 auVar287 [32];
  float fVar288;
  float fVar289;
  float fVar291;
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  undefined1 auVar290 [32];
  float fVar303;
  float fVar305;
  float fVar306;
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  undefined1 auVar304 [32];
  UVIdentity<8> mapUV;
  Precalculations pre;
  vbool<8> terminated;
  RTCFilterFunctionNArguments args;
  vbool<8> valid0;
  PlueckerHitM<8,_embree::avx::UVIdentity<8>_> hit;
  TravRayK<8,_true> tray;
  vint<8> itime;
  vfloat<8> ftime;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  undefined1 local_2ee1;
  ulong local_2ee0;
  undefined1 (*local_2ed8) [32];
  ulong *local_2ed0;
  Precalculations local_2ec5;
  uint local_2ec4;
  ulong local_2ec0;
  ulong local_2eb8;
  long local_2eb0;
  uint local_2ea8;
  uint local_2ea4;
  undefined1 local_2ea0 [8];
  undefined8 uStack_2e98;
  undefined8 uStack_2e90;
  undefined8 uStack_2e88;
  undefined1 local_2e80 [40];
  RayK<8> *local_2e58;
  RayQueryContext *local_2e50;
  ulong local_2e48;
  undefined1 local_2e40 [32];
  undefined1 local_2e20 [32];
  undefined1 local_2e00 [20];
  uint uStack_2dec;
  uint uStack_2de8;
  uint uStack_2de4;
  BVH *local_2dd8;
  Intersectors *local_2dd0;
  long local_2dc8;
  long local_2dc0;
  ulong local_2db8;
  RayK<8> *local_2db0;
  ulong local_2da8;
  ulong local_2da0;
  long local_2d98;
  long local_2d90;
  Scene *local_2d88;
  undefined1 local_2d80 [32];
  undefined8 local_2d60;
  undefined8 uStack_2d58;
  undefined8 uStack_2d50;
  undefined8 uStack_2d48;
  RTCFilterFunctionNArguments local_2d30;
  undefined1 local_2d00 [32];
  undefined1 local_2ce0 [32];
  undefined1 local_2cc0 [32];
  undefined1 local_2ca0 [32];
  undefined1 local_2c80 [8];
  float fStack_2c78;
  float fStack_2c74;
  float fStack_2c70;
  float fStack_2c6c;
  float fStack_2c68;
  float fStack_2c64;
  undefined1 local_2c60 [32];
  undefined1 local_2c40 [32];
  undefined1 *local_2c20;
  undefined1 local_2c00 [32];
  undefined1 local_2be0 [32];
  undefined1 local_2bc0 [32];
  undefined1 local_2ba0 [32];
  float local_2b80 [4];
  float fStack_2b70;
  float fStack_2b6c;
  float fStack_2b68;
  undefined4 uStack_2b64;
  float local_2b60 [4];
  float fStack_2b50;
  float fStack_2b4c;
  float fStack_2b48;
  undefined4 uStack_2b44;
  float local_2b40 [4];
  float fStack_2b30;
  float fStack_2b2c;
  float fStack_2b28;
  undefined4 uStack_2b24;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2b20;
  undefined1 local_2ac0 [32];
  undefined1 local_2aa0 [32];
  undefined1 local_2a80 [32];
  undefined1 local_2a60 [8];
  float fStack_2a58;
  float fStack_2a54;
  float fStack_2a50;
  float fStack_2a4c;
  float fStack_2a48;
  undefined1 local_2a40 [8];
  float fStack_2a38;
  float fStack_2a34;
  float fStack_2a30;
  float fStack_2a2c;
  float fStack_2a28;
  undefined1 local_2a20 [8];
  float fStack_2a18;
  float fStack_2a14;
  float fStack_2a10;
  float fStack_2a0c;
  float fStack_2a08;
  undefined1 local_2a00 [32];
  undefined1 local_29e0 [32];
  undefined1 local_29c0 [32];
  undefined1 local_29a0 [32];
  undefined1 local_2980 [32];
  undefined1 local_2960 [8];
  float fStack_2958;
  float fStack_2954;
  undefined1 auStack_2950 [16];
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined4 local_2900;
  undefined4 uStack_28fc;
  undefined4 uStack_28f8;
  undefined4 uStack_28f4;
  undefined4 uStack_28f0;
  undefined4 uStack_28ec;
  undefined4 uStack_28e8;
  undefined4 uStack_28e4;
  undefined4 local_28e0;
  undefined4 uStack_28dc;
  undefined4 uStack_28d8;
  undefined4 uStack_28d4;
  undefined4 uStack_28d0;
  undefined4 uStack_28cc;
  undefined4 uStack_28c8;
  undefined4 uStack_28c4;
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_2800 [32];
  float local_27e0;
  float fStack_27dc;
  float fStack_27d8;
  float fStack_27d4;
  float fStack_27d0;
  float fStack_27cc;
  float fStack_27c8;
  undefined4 uStack_27c4;
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [8];
  float fStack_2798;
  float fStack_2794;
  float fStack_2790;
  float fStack_278c;
  float fStack_2788;
  undefined1 local_2780 [32];
  undefined1 local_2760 [8];
  float fStack_2758;
  float fStack_2754;
  float fStack_2750;
  float fStack_274c;
  float fStack_2748;
  undefined1 local_2740 [8];
  float fStack_2738;
  float fStack_2734;
  float fStack_2730;
  float fStack_272c;
  float fStack_2728;
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined4 local_1e80;
  undefined4 uStack_1e7c;
  undefined4 uStack_1e78;
  undefined4 uStack_1e74;
  undefined4 uStack_1e70;
  undefined4 uStack_1e6c;
  undefined4 uStack_1e68;
  undefined4 uStack_1e64;
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  
  local_2dd8 = (BVH *)This->ptr;
  if ((local_2dd8->root).ptr != 8) {
    auVar103 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar102 = vpcmpeqd_avx(auVar103,*(undefined1 (*) [16])(valid_i->field_0).field_1.vl);
    auVar103 = vpcmpeqd_avx(auVar103,*(undefined1 (*) [16])((long)&valid_i->field_0 + 0x10));
    auVar161 = ZEXT816(0) << 0x40;
    auVar105 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar161),5);
    auVar165._16_16_ = auVar103;
    auVar165._0_16_ = auVar102;
    auVar125 = auVar165 & auVar105;
    if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar125 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar125 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar125 >> 0x7f,0) != '\0') ||
          (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar125 >> 0xbf,0) != '\0') ||
        (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar125[0x1f] < '\0') {
      local_2840 = vandps_avx(auVar105,auVar165);
      local_2b20._0_8_ = *(undefined8 *)ray;
      local_2b20._8_8_ = *(undefined8 *)(ray + 8);
      local_2b20._16_8_ = *(undefined8 *)(ray + 0x10);
      local_2b20._24_8_ = *(undefined8 *)(ray + 0x18);
      local_2b20._32_8_ = *(undefined8 *)(ray + 0x20);
      local_2b20._40_8_ = *(undefined8 *)(ray + 0x28);
      local_2b20._48_8_ = *(undefined8 *)(ray + 0x30);
      local_2b20._56_8_ = *(undefined8 *)(ray + 0x38);
      local_2b20._64_8_ = *(undefined8 *)(ray + 0x40);
      local_2b20._72_8_ = *(undefined8 *)(ray + 0x48);
      local_2b20._80_8_ = *(undefined8 *)(ray + 0x50);
      local_2b20._88_8_ = *(undefined8 *)(ray + 0x58);
      local_2ac0 = *(undefined1 (*) [32])(ray + 0x80);
      local_2aa0 = *(undefined1 (*) [32])(ray + 0xa0);
      local_2a80 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar243._8_4_ = 0x7fffffff;
      auVar243._0_8_ = 0x7fffffff7fffffff;
      auVar243._12_4_ = 0x7fffffff;
      auVar243._16_4_ = 0x7fffffff;
      auVar243._20_4_ = 0x7fffffff;
      auVar243._24_4_ = 0x7fffffff;
      auVar243._28_4_ = 0x7fffffff;
      auVar105 = vandps_avx(auVar243,local_2ac0);
      auVar262._8_4_ = 0x219392ef;
      auVar262._0_8_ = 0x219392ef219392ef;
      auVar262._12_4_ = 0x219392ef;
      auVar262._16_4_ = 0x219392ef;
      auVar262._20_4_ = 0x219392ef;
      auVar262._24_4_ = 0x219392ef;
      auVar262._28_4_ = 0x219392ef;
      auVar225._8_4_ = 0x3f800000;
      auVar225._0_8_ = &DAT_3f8000003f800000;
      auVar225._12_4_ = 0x3f800000;
      auVar225._16_4_ = 0x3f800000;
      auVar225._20_4_ = 0x3f800000;
      auVar225._24_4_ = 0x3f800000;
      auVar225._28_4_ = 0x3f800000;
      auVar125 = vcmpps_avx(auVar105,auVar262,1);
      auVar166 = vdivps_avx(auVar225,local_2ac0);
      auVar105 = vandps_avx(auVar243,local_2aa0);
      auVar185 = vdivps_avx(auVar225,local_2aa0);
      auVar165 = vcmpps_avx(auVar105,auVar262,1);
      auVar200 = vdivps_avx(auVar225,local_2a80);
      auVar105 = vandps_avx(auVar243,local_2a80);
      auVar105 = vcmpps_avx(auVar105,auVar262,1);
      auVar244._8_4_ = 0x5d5e0b6b;
      auVar244._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar244._12_4_ = 0x5d5e0b6b;
      auVar244._16_4_ = 0x5d5e0b6b;
      auVar244._20_4_ = 0x5d5e0b6b;
      auVar244._24_4_ = 0x5d5e0b6b;
      auVar244._28_4_ = 0x5d5e0b6b;
      _local_2a60 = vblendvps_avx(auVar166,auVar244,auVar125);
      _local_2a40 = vblendvps_avx(auVar185,auVar244,auVar165);
      _local_2a20 = vblendvps_avx(auVar200,auVar244,auVar105);
      auVar105 = vcmpps_avx(_local_2a60,ZEXT1632(auVar161),1);
      auVar200._8_4_ = 0x10;
      auVar200._0_8_ = 0x1000000010;
      auVar200._12_4_ = 0x10;
      auVar200._16_4_ = 0x10;
      auVar200._20_4_ = 0x10;
      auVar200._24_4_ = 0x10;
      auVar200._28_4_ = 0x10;
      local_2a00 = vandps_avx(auVar105,auVar200);
      auVar125 = ZEXT1632(auVar161);
      auVar105 = vcmpps_avx(_local_2a40,auVar125,5);
      auVar201._8_4_ = 0x20;
      auVar201._0_8_ = 0x2000000020;
      auVar201._12_4_ = 0x20;
      auVar201._16_4_ = 0x20;
      auVar201._20_4_ = 0x20;
      auVar201._24_4_ = 0x20;
      auVar201._28_4_ = 0x20;
      auVar210._8_4_ = 0x30;
      auVar210._0_8_ = 0x3000000030;
      auVar210._12_4_ = 0x30;
      auVar210._16_4_ = 0x30;
      auVar210._20_4_ = 0x30;
      auVar210._24_4_ = 0x30;
      auVar210._28_4_ = 0x30;
      local_29e0 = vblendvps_avx(auVar210,auVar201,auVar105);
      auVar105 = vcmpps_avx(_local_2a20,auVar125,5);
      auVar185._8_4_ = 0x40;
      auVar185._0_8_ = 0x4000000040;
      auVar185._12_4_ = 0x40;
      auVar185._16_4_ = 0x40;
      auVar185._20_4_ = 0x40;
      auVar185._24_4_ = 0x40;
      auVar185._28_4_ = 0x40;
      auVar202._8_4_ = 0x50;
      auVar202._0_8_ = 0x5000000050;
      auVar202._12_4_ = 0x50;
      auVar202._16_4_ = 0x50;
      auVar202._20_4_ = 0x50;
      auVar202._24_4_ = 0x50;
      auVar202._28_4_ = 0x50;
      local_29c0 = vblendvps_avx(auVar202,auVar185,auVar105);
      auVar105 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar125);
      auVar166._8_4_ = 0x7f800000;
      auVar166._0_8_ = 0x7f8000007f800000;
      auVar166._12_4_ = 0x7f800000;
      auVar166._16_4_ = 0x7f800000;
      auVar166._20_4_ = 0x7f800000;
      auVar166._24_4_ = 0x7f800000;
      auVar166._28_4_ = 0x7f800000;
      local_29a0 = vblendvps_avx(auVar166,auVar105,local_2840);
      auVar105 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar125);
      auVar125._8_4_ = 0xff800000;
      auVar125._0_8_ = 0xff800000ff800000;
      auVar125._12_4_ = 0xff800000;
      auVar125._16_4_ = 0xff800000;
      auVar125._20_4_ = 0xff800000;
      auVar125._24_4_ = 0xff800000;
      auVar125._28_4_ = 0xff800000;
      local_2980 = vblendvps_avx(auVar125,auVar105,local_2840);
      auVar105 = vcmpps_avx(local_2980,local_2980,0xf);
      local_2e00._4_4_ = local_2840._4_4_ ^ auVar105._4_4_;
      local_2e00._0_4_ = local_2840._0_4_ ^ auVar105._0_4_;
      local_2e00._8_4_ = local_2840._8_4_ ^ auVar105._8_4_;
      local_2e00._12_4_ = local_2840._12_4_ ^ auVar105._12_4_;
      local_2e00._16_4_ = local_2840._16_4_ ^ auVar105._16_4_;
      uStack_2dec = local_2840._20_4_ ^ auVar105._20_4_;
      uStack_2de8 = local_2840._24_4_ ^ auVar105._24_4_;
      uStack_2de4 = local_2840._28_4_ ^ auVar105._28_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar97 = 5;
      }
      else {
        uVar97 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                        RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      local_2e58 = ray + 0x100;
      puVar92 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar93 = (undefined1 (*) [32])local_1e40;
      local_1e80 = 0x7f800000;
      uStack_1e7c = 0x7f800000;
      uStack_1e78 = 0x7f800000;
      uStack_1e74 = 0x7f800000;
      uStack_1e70 = 0x7f800000;
      uStack_1e6c = 0x7f800000;
      uStack_1e68 = 0x7f800000;
      uStack_1e64 = 0x7f800000;
      local_2608 = (local_2dd8->root).ptr;
      local_1e60 = local_29a0;
      local_2780._16_16_ = mm_lookupmask_ps._240_16_;
      local_2780._0_16_ = mm_lookupmask_ps._0_16_;
      auVar105._8_4_ = 0xbf800000;
      auVar105._0_8_ = 0xbf800000bf800000;
      auVar105._12_4_ = 0xbf800000;
      auVar105._16_4_ = 0xbf800000;
      auVar105._20_4_ = 0xbf800000;
      auVar105._24_4_ = 0xbf800000;
      auVar105._28_4_ = 0xbf800000;
      auVar126._8_4_ = 0x3f800000;
      auVar126._0_8_ = &DAT_3f8000003f800000;
      auVar126._12_4_ = 0x3f800000;
      auVar126._16_4_ = 0x3f800000;
      auVar126._20_4_ = 0x3f800000;
      auVar126._24_4_ = 0x3f800000;
      auVar126._28_4_ = 0x3f800000;
      _local_27a0 = vblendvps_avx(auVar126,auVar105,local_2780);
      auVar105 = vcmpps_avx(auVar126,auVar126,0xf);
      auVar132 = ZEXT3264(auVar105);
      local_2dd0 = This;
      do {
        pauVar93 = pauVar93 + -1;
        local_2ee0 = puVar92[-1];
        puVar92 = puVar92 + -1;
        if (local_2ee0 == 0xfffffffffffffff8) {
LAB_003b4bfa:
          iVar88 = 3;
        }
        else {
          _local_2ea0 = *pauVar93;
          auVar154 = ZEXT3264(_local_2ea0);
          auVar103 = local_2ea0._0_16_;
          auVar105 = vcmpps_avx(_local_2ea0,local_2980,1);
          if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar105 >> 0x7f,0) == '\0') &&
                (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar105 >> 0xbf,0) == '\0') &&
              (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar105[0x1f]) {
LAB_003b4bfe:
            iVar88 = 2;
          }
          else {
            uVar91 = vmovmskps_avx(auVar105);
            unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar91);
            iVar88 = 0;
            if ((uint)POPCOUNT(uVar91) <= uVar97) {
              for (; unaff_RBX != 0; unaff_RBX = unaff_RBX & unaff_RBX - 1) {
                k = 0;
                if (unaff_RBX != 0) {
                  for (; (unaff_RBX >> k & 1) == 0; k = k + 1) {
                  }
                }
                local_2e20._0_8_ = k;
                auVar154 = ZEXT1664(auVar154._0_16_);
                local_2ed8 = pauVar93;
                local_2ed0 = puVar92;
                bVar100 = occluded1(local_2dd0,local_2dd8,(NodeRef)local_2ee0,k,&local_2ec5,ray,
                                    (TravRayK<8,_true> *)&local_2b20.field_0,context);
                auVar103 = auVar154._0_16_;
                if (bVar100) {
                  *(undefined4 *)(local_2e00 + local_2e20._0_8_ * 4) = 0xffffffff;
                }
                pauVar93 = local_2ed8;
                puVar92 = local_2ed0;
              }
              auVar103 = vpcmpeqd_avx(auVar103,auVar103);
              auVar102 = vpcmpgtd_avx(stack0xffffffffffffd210,auVar103);
              auVar103 = vpcmpgtd_avx(local_2e00._0_16_,auVar103);
              auVar103 = vpor_avx(auVar103,auVar102);
              iVar88 = 3;
              auVar105 = vcmpps_avx(ZEXT1632(auVar103),ZEXT1632(auVar103),0xf);
              auVar132 = ZEXT3264(auVar105);
              auVar154 = ZEXT3264(_local_2ea0);
              unaff_RBX = 0;
              if ((((auVar103 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar103 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar103 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar103[0xf] < '\0') {
                auVar153._8_4_ = 0xff800000;
                auVar153._0_8_ = 0xff800000ff800000;
                auVar153._12_4_ = 0xff800000;
                auVar153._16_4_ = 0xff800000;
                auVar153._20_4_ = 0xff800000;
                auVar153._24_4_ = 0xff800000;
                auVar153._28_4_ = 0xff800000;
                auVar105 = vblendvps_avx(local_2980,auVar153,_local_2e00);
                auVar154 = ZEXT3264(_local_2ea0);
                auVar125 = vcmpps_avx(local_2980,local_2980,0xf);
                auVar132 = ZEXT3264(auVar125);
                local_2980 = auVar105;
                iVar88 = 2;
              }
            }
            if ((uint)uVar97 < (uint)POPCOUNT(uVar91)) {
              do {
                auVar103 = auVar154._0_16_;
                uVar86 = (uint)local_2ee0;
                if ((local_2ee0 & 8) != 0) {
                  if (local_2ee0 == 0xfffffffffffffff8) goto LAB_003b4bfa;
                  auVar105 = vcmpps_avx(local_2980,auVar154._0_32_,6);
                  if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar105 >> 0x7f,0) != '\0') ||
                        (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar105 >> 0xbf,0) != '\0') ||
                      (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar105[0x1f] < '\0') {
                    local_2dc8 = (ulong)(uVar86 & 0xf) - 8;
                    auVar122 = _local_2e00;
                    if (local_2dc8 != 0) {
                      uVar94 = local_2ee0 & 0xfffffffffffffff0;
                      local_2d00._4_4_ = local_2e00._4_4_ ^ auVar132._4_4_;
                      local_2d00._0_4_ = local_2e00._0_4_ ^ auVar132._0_4_;
                      local_2d00._8_4_ = local_2e00._8_4_ ^ auVar132._8_4_;
                      local_2d00._12_4_ = local_2e00._12_4_ ^ auVar132._12_4_;
                      local_2d00._16_4_ = local_2e00._16_4_ ^ auVar132._16_4_;
                      local_2d00._20_4_ = local_2e00._20_4_ ^ auVar132._20_4_;
                      local_2d00._24_4_ = local_2e00._24_4_ ^ auVar132._24_4_;
                      local_2d00._28_4_ = local_2e00._28_4_ ^ auVar132._28_4_;
                      lVar85 = 0;
                      local_2ee0 = uVar94;
                      local_2ed8 = pauVar93;
                      local_2ed0 = puVar92;
                      local_2ec0 = uVar97;
                      local_2e50 = context;
                      local_2db0 = ray;
                      do {
                        lVar82 = lVar85 * 0x90;
                        auVar103._8_8_ = 0;
                        auVar103._0_8_ = *(ulong *)(uVar94 + 0x20 + lVar82);
                        auVar102._8_8_ = 0;
                        auVar102._0_8_ = *(ulong *)(uVar94 + 0x24 + lVar82);
                        auVar102 = vpminub_avx(auVar103,auVar102);
                        auVar103 = vpcmpeqb_avx(auVar103,auVar102);
                        auVar102 = vpcmpeqd_avx(auVar102,auVar102);
                        auVar103 = vpmovzxbd_avx(auVar103 ^ auVar102);
                        auVar103 = vpslld_avx(auVar103 ^ auVar102,0x1f);
                        uVar86 = vmovmskps_avx(auVar103);
                        local_2dc0 = lVar85;
                        if (uVar86 != 0) {
                          unaff_RBX = uVar94 + lVar82;
                          uVar91 = *(undefined4 *)(uVar94 + 0x80 + lVar82);
                          auVar110._4_4_ = uVar91;
                          auVar110._0_4_ = uVar91;
                          auVar110._8_4_ = uVar91;
                          auVar110._12_4_ = uVar91;
                          auVar110._16_4_ = uVar91;
                          auVar110._20_4_ = uVar91;
                          auVar110._24_4_ = uVar91;
                          auVar110._28_4_ = uVar91;
                          auVar105 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar110);
                          fVar206 = *(float *)(uVar94 + 0x84 + lVar82);
                          local_27e0 = fVar206 * auVar105._0_4_;
                          fStack_27dc = fVar206 * auVar105._4_4_;
                          fStack_27d8 = fVar206 * auVar105._8_4_;
                          fStack_27d4 = fVar206 * auVar105._12_4_;
                          fStack_27d0 = fVar206 * auVar105._16_4_;
                          fStack_27cc = fVar206 * auVar105._20_4_;
                          fStack_27c8 = fVar206 * auVar105._24_4_;
                          uStack_27c4 = auVar105._28_4_;
                          uVar81 = (ulong)(uVar86 & 0xff);
                          local_2eb8 = unaff_RBX;
                          do {
                            auVar125 = _local_2960;
                            auVar105 = _local_2c80;
                            lVar85 = 0;
                            if (uVar81 != 0) {
                              for (; (uVar81 >> lVar85 & 1) == 0; lVar85 = lVar85 + 1) {
                              }
                            }
                            auVar161._8_8_ = 0;
                            auVar161._0_8_ = *(ulong *)(unaff_RBX + 0x20);
                            auVar103 = vpmovzxbd_avx(auVar161);
                            auVar103 = vcvtdq2ps_avx(auVar103);
                            fVar206 = *(float *)(unaff_RBX + 0x44);
                            fVar213 = *(float *)(unaff_RBX + 0x38);
                            local_2c80._4_4_ = fVar213 + fVar206 * auVar103._4_4_;
                            local_2c80._0_4_ = fVar213 + fVar206 * auVar103._0_4_;
                            fStack_2c78 = fVar213 + fVar206 * auVar103._8_4_;
                            _fStack_2c70 = auVar105._16_16_;
                            fStack_2c74 = fVar213 + fVar206 * auVar103._12_4_;
                            fVar155 = *(float *)(local_2c80 + lVar85 * 4);
                            auVar162._8_8_ = 0;
                            auVar162._0_8_ = *(ulong *)(unaff_RBX + 0x50);
                            auVar103 = vpmovzxbd_avx(auVar162);
                            auVar103 = vcvtdq2ps_avx(auVar103);
                            fVar156 = *(float *)(unaff_RBX + 0x74);
                            fVar157 = *(float *)(unaff_RBX + 0x68);
                            local_2960._4_4_ = fVar157 + fVar156 * auVar103._4_4_;
                            local_2960._0_4_ = fVar157 + fVar156 * auVar103._0_4_;
                            fStack_2958 = fVar157 + fVar156 * auVar103._8_4_;
                            auStack_2950 = auVar125._16_16_;
                            fStack_2954 = fVar157 + fVar156 * auVar103._12_4_;
                            auVar103 = vshufps_avx(ZEXT416((uint)(*(float *)(local_2960 + lVar85 * 4
                                                                            ) - fVar155)),
                                                   ZEXT416((uint)(*(float *)(local_2960 + lVar85 * 4
                                                                            ) - fVar155)),0);
                            auVar111._0_4_ = fVar155 + local_27e0 * auVar103._0_4_;
                            auVar111._4_4_ = fVar155 + fStack_27dc * auVar103._4_4_;
                            auVar111._8_4_ = fVar155 + fStack_27d8 * auVar103._8_4_;
                            auVar111._12_4_ = fVar155 + fStack_27d4 * auVar103._12_4_;
                            auVar111._16_4_ = fVar155 + fStack_27d0 * auVar103._0_4_;
                            auVar111._20_4_ = fVar155 + fStack_27cc * auVar103._4_4_;
                            auVar111._24_4_ = fVar155 + fStack_27c8 * auVar103._8_4_;
                            auVar111._28_4_ = fVar155 + auVar103._12_4_;
                            auVar163._8_8_ = 0;
                            auVar163._0_8_ = *(ulong *)(unaff_RBX + 0x24);
                            auVar103 = vpmovzxbd_avx(auVar163);
                            auVar103 = vcvtdq2ps_avx(auVar103);
                            local_2c80._4_4_ = fVar213 + fVar206 * auVar103._4_4_;
                            local_2c80._0_4_ = fVar213 + fVar206 * auVar103._0_4_;
                            fStack_2c78 = fVar213 + fVar206 * auVar103._8_4_;
                            fStack_2c74 = fVar213 + fVar206 * auVar103._12_4_;
                            fVar206 = *(float *)(local_2c80 + lVar85 * 4);
                            auVar142._8_8_ = 0;
                            auVar142._0_8_ = *(ulong *)(unaff_RBX + 0x54);
                            auVar103 = vpmovzxbd_avx(auVar142);
                            auVar103 = vcvtdq2ps_avx(auVar103);
                            local_2960._4_4_ = fVar157 + fVar156 * auVar103._4_4_;
                            local_2960._0_4_ = fVar157 + fVar156 * auVar103._0_4_;
                            fStack_2958 = fVar157 + fVar156 * auVar103._8_4_;
                            fStack_2954 = fVar157 + fVar156 * auVar103._12_4_;
                            auVar103 = vshufps_avx(ZEXT416((uint)(*(float *)(local_2960 + lVar85 * 4
                                                                            ) - fVar206)),
                                                   ZEXT416((uint)(*(float *)(local_2960 + lVar85 * 4
                                                                            ) - fVar206)),0);
                            auVar128._0_4_ = fVar206 + local_27e0 * auVar103._0_4_;
                            auVar128._4_4_ = fVar206 + fStack_27dc * auVar103._4_4_;
                            auVar128._8_4_ = fVar206 + fStack_27d8 * auVar103._8_4_;
                            auVar128._12_4_ = fVar206 + fStack_27d4 * auVar103._12_4_;
                            auVar128._16_4_ = fVar206 + fStack_27d0 * auVar103._0_4_;
                            auVar128._20_4_ = fVar206 + fStack_27cc * auVar103._4_4_;
                            auVar128._24_4_ = fVar206 + fStack_27c8 * auVar103._8_4_;
                            auVar128._28_4_ = fVar206 + auVar103._12_4_;
                            auVar143._8_8_ = 0;
                            auVar143._0_8_ = *(ulong *)(unaff_RBX + 0x28);
                            auVar103 = vpmovzxbd_avx(auVar143);
                            auVar103 = vcvtdq2ps_avx(auVar103);
                            fVar206 = *(float *)(unaff_RBX + 0x48);
                            fVar213 = *(float *)(unaff_RBX + 0x3c);
                            local_2c80._4_4_ = fVar213 + fVar206 * auVar103._4_4_;
                            local_2c80._0_4_ = fVar213 + fVar206 * auVar103._0_4_;
                            fStack_2c78 = fVar213 + fVar206 * auVar103._8_4_;
                            fStack_2c74 = fVar213 + fVar206 * auVar103._12_4_;
                            fVar155 = *(float *)(local_2c80 + lVar85 * 4);
                            auVar197._8_8_ = 0;
                            auVar197._0_8_ = *(ulong *)(unaff_RBX + 0x58);
                            auVar103 = vpmovzxbd_avx(auVar197);
                            auVar103 = vcvtdq2ps_avx(auVar103);
                            fVar156 = *(float *)(unaff_RBX + 0x78);
                            fVar157 = *(float *)(unaff_RBX + 0x6c);
                            local_2960._4_4_ = fVar157 + fVar156 * auVar103._4_4_;
                            local_2960._0_4_ = fVar157 + fVar156 * auVar103._0_4_;
                            fStack_2958 = fVar157 + fVar156 * auVar103._8_4_;
                            fStack_2954 = fVar157 + fVar156 * auVar103._12_4_;
                            auVar103 = vshufps_avx(ZEXT416((uint)(*(float *)(local_2960 + lVar85 * 4
                                                                            ) - fVar155)),
                                                   ZEXT416((uint)(*(float *)(local_2960 + lVar85 * 4
                                                                            ) - fVar155)),0);
                            auVar148._0_4_ = fVar155 + local_27e0 * auVar103._0_4_;
                            auVar148._4_4_ = fVar155 + fStack_27dc * auVar103._4_4_;
                            auVar148._8_4_ = fVar155 + fStack_27d8 * auVar103._8_4_;
                            auVar148._12_4_ = fVar155 + fStack_27d4 * auVar103._12_4_;
                            auVar148._16_4_ = fVar155 + fStack_27d0 * auVar103._0_4_;
                            auVar148._20_4_ = fVar155 + fStack_27cc * auVar103._4_4_;
                            auVar148._24_4_ = fVar155 + fStack_27c8 * auVar103._8_4_;
                            auVar148._28_4_ = fVar155 + auVar103._12_4_;
                            auVar198._8_8_ = 0;
                            auVar198._0_8_ = *(ulong *)(unaff_RBX + 0x2c);
                            auVar103 = vpmovzxbd_avx(auVar198);
                            auVar103 = vcvtdq2ps_avx(auVar103);
                            local_2c80._4_4_ = fVar213 + fVar206 * auVar103._4_4_;
                            local_2c80._0_4_ = fVar213 + fVar206 * auVar103._0_4_;
                            fStack_2c78 = fVar213 + fVar206 * auVar103._8_4_;
                            fStack_2c74 = fVar213 + fVar206 * auVar103._12_4_;
                            fVar206 = *(float *)(local_2c80 + lVar85 * 4);
                            auVar182._8_8_ = 0;
                            auVar182._0_8_ = *(ulong *)(unaff_RBX + 0x5c);
                            auVar103 = vpmovzxbd_avx(auVar182);
                            auVar103 = vcvtdq2ps_avx(auVar103);
                            local_2960._4_4_ = fVar157 + fVar156 * auVar103._4_4_;
                            local_2960._0_4_ = fVar157 + fVar156 * auVar103._0_4_;
                            fStack_2958 = fVar157 + fVar156 * auVar103._8_4_;
                            fStack_2954 = fVar157 + fVar156 * auVar103._12_4_;
                            auVar103 = vshufps_avx(ZEXT416((uint)(*(float *)(local_2960 + lVar85 * 4
                                                                            ) - fVar206)),
                                                   ZEXT416((uint)(*(float *)(local_2960 + lVar85 * 4
                                                                            ) - fVar206)),0);
                            auVar169._0_4_ = fVar206 + local_27e0 * auVar103._0_4_;
                            auVar169._4_4_ = fVar206 + fStack_27dc * auVar103._4_4_;
                            auVar169._8_4_ = fVar206 + fStack_27d8 * auVar103._8_4_;
                            auVar169._12_4_ = fVar206 + fStack_27d4 * auVar103._12_4_;
                            auVar169._16_4_ = fVar206 + fStack_27d0 * auVar103._0_4_;
                            auVar169._20_4_ = fVar206 + fStack_27cc * auVar103._4_4_;
                            auVar169._24_4_ = fVar206 + fStack_27c8 * auVar103._8_4_;
                            auVar169._28_4_ = fVar206 + auVar103._12_4_;
                            auVar183._8_8_ = 0;
                            auVar183._0_8_ = *(ulong *)(unaff_RBX + 0x30);
                            auVar103 = vpmovzxbd_avx(auVar183);
                            auVar103 = vcvtdq2ps_avx(auVar103);
                            fVar206 = *(float *)(unaff_RBX + 0x4c);
                            fVar213 = *(float *)(unaff_RBX + 0x40);
                            local_2c80._4_4_ = fVar213 + fVar206 * auVar103._4_4_;
                            local_2c80._0_4_ = fVar213 + fVar206 * auVar103._0_4_;
                            fStack_2c78 = fVar213 + fVar206 * auVar103._8_4_;
                            fStack_2c74 = fVar213 + fVar206 * auVar103._12_4_;
                            fVar155 = *(float *)(local_2c80 + lVar85 * 4);
                            auVar222._8_8_ = 0;
                            auVar222._0_8_ = *(ulong *)(unaff_RBX + 0x60);
                            auVar103 = vpmovzxbd_avx(auVar222);
                            auVar103 = vcvtdq2ps_avx(auVar103);
                            fVar156 = *(float *)(unaff_RBX + 0x7c);
                            fVar157 = *(float *)(unaff_RBX + 0x70);
                            local_2960._4_4_ = fVar157 + fVar156 * auVar103._4_4_;
                            local_2960._0_4_ = fVar157 + fVar156 * auVar103._0_4_;
                            fStack_2958 = fVar157 + fVar156 * auVar103._8_4_;
                            fStack_2954 = fVar157 + fVar156 * auVar103._12_4_;
                            auVar103 = vshufps_avx(ZEXT416((uint)(*(float *)(local_2960 + lVar85 * 4
                                                                            ) - fVar155)),
                                                   ZEXT416((uint)(*(float *)(local_2960 + lVar85 * 4
                                                                            ) - fVar155)),0);
                            auVar188._0_4_ = fVar155 + local_27e0 * auVar103._0_4_;
                            auVar188._4_4_ = fVar155 + fStack_27dc * auVar103._4_4_;
                            auVar188._8_4_ = fVar155 + fStack_27d8 * auVar103._8_4_;
                            auVar188._12_4_ = fVar155 + fStack_27d4 * auVar103._12_4_;
                            auVar188._16_4_ = fVar155 + fStack_27d0 * auVar103._0_4_;
                            auVar188._20_4_ = fVar155 + fStack_27cc * auVar103._4_4_;
                            auVar188._24_4_ = fVar155 + fStack_27c8 * auVar103._8_4_;
                            auVar188._28_4_ = fVar155 + auVar103._12_4_;
                            auVar223._8_8_ = 0;
                            auVar223._0_8_ = *(ulong *)(unaff_RBX + 0x34);
                            auVar103 = vpmovzxbd_avx(auVar223);
                            auVar103 = vcvtdq2ps_avx(auVar103);
                            local_2c80._4_4_ = fVar213 + fVar206 * auVar103._4_4_;
                            local_2c80._0_4_ = fVar213 + fVar206 * auVar103._0_4_;
                            fStack_2c78 = fVar213 + fVar206 * auVar103._8_4_;
                            fStack_2c74 = fVar213 + fVar206 * auVar103._12_4_;
                            fVar206 = *(float *)(local_2c80 + lVar85 * 4);
                            auVar208._8_8_ = 0;
                            auVar208._0_8_ = *(ulong *)(unaff_RBX + 100);
                            auVar103 = vpmovzxbd_avx(auVar208);
                            auVar103 = vcvtdq2ps_avx(auVar103);
                            local_2960._4_4_ = fVar157 + fVar156 * auVar103._4_4_;
                            local_2960._0_4_ = fVar157 + fVar156 * auVar103._0_4_;
                            fStack_2958 = fVar157 + fVar156 * auVar103._8_4_;
                            fStack_2954 = fVar157 + fVar156 * auVar103._12_4_;
                            auVar103 = vshufps_avx(ZEXT416((uint)(*(float *)(local_2960 + lVar85 * 4
                                                                            ) - fVar206)),
                                                   ZEXT416((uint)(*(float *)(local_2960 + lVar85 * 4
                                                                            ) - fVar206)),0);
                            auVar204._0_4_ = fVar206 + local_27e0 * auVar103._0_4_;
                            auVar204._4_4_ = fVar206 + fStack_27dc * auVar103._4_4_;
                            auVar204._8_4_ = fVar206 + fStack_27d8 * auVar103._8_4_;
                            auVar204._12_4_ = fVar206 + fStack_27d4 * auVar103._12_4_;
                            auVar204._16_4_ = fVar206 + fStack_27d0 * auVar103._0_4_;
                            auVar204._20_4_ = fVar206 + fStack_27cc * auVar103._4_4_;
                            auVar204._24_4_ = fVar206 + fStack_27c8 * auVar103._8_4_;
                            auVar204._28_4_ = fVar206 + auVar103._12_4_;
                            auVar74._8_8_ = local_2b20._8_8_;
                            auVar74._0_8_ = local_2b20._0_8_;
                            auVar74._16_8_ = local_2b20._16_8_;
                            auVar74._24_8_ = local_2b20._24_8_;
                            auVar76._8_8_ = local_2b20._40_8_;
                            auVar76._0_8_ = local_2b20._32_8_;
                            auVar76._16_8_ = local_2b20._48_8_;
                            auVar76._24_8_ = local_2b20._56_8_;
                            auVar78._8_8_ = local_2b20._72_8_;
                            auVar78._0_8_ = local_2b20._64_8_;
                            auVar78._16_8_ = local_2b20._80_8_;
                            auVar78._24_8_ = local_2b20._88_8_;
                            auVar105 = vsubps_avx(auVar111,auVar74);
                            auVar25._4_4_ = local_2a60._4_4_ * auVar105._4_4_;
                            auVar25._0_4_ = local_2a60._0_4_ * auVar105._0_4_;
                            auVar25._8_4_ = local_2a60._8_4_ * auVar105._8_4_;
                            auVar25._12_4_ = local_2a60._12_4_ * auVar105._12_4_;
                            auVar25._16_4_ = local_2a60._16_4_ * auVar105._16_4_;
                            auVar25._20_4_ = local_2a60._20_4_ * auVar105._20_4_;
                            auVar25._24_4_ = local_2a60._24_4_ * auVar105._24_4_;
                            auVar25._28_4_ = auVar105._28_4_;
                            auVar105 = vsubps_avx(auVar148,auVar76);
                            auVar26._4_4_ = (float)local_2a40._4_4_ * auVar105._4_4_;
                            auVar26._0_4_ = (float)local_2a40._0_4_ * auVar105._0_4_;
                            auVar26._8_4_ = fStack_2a38 * auVar105._8_4_;
                            auVar26._12_4_ = fStack_2a34 * auVar105._12_4_;
                            auVar26._16_4_ = fStack_2a30 * auVar105._16_4_;
                            auVar26._20_4_ = fStack_2a2c * auVar105._20_4_;
                            auVar26._24_4_ = fStack_2a28 * auVar105._24_4_;
                            auVar26._28_4_ = auVar105._28_4_;
                            auVar154 = ZEXT3264(auVar26);
                            auVar105 = vsubps_avx(auVar188,auVar78);
                            auVar27._4_4_ = (float)local_2a20._4_4_ * auVar105._4_4_;
                            auVar27._0_4_ = (float)local_2a20._0_4_ * auVar105._0_4_;
                            auVar27._8_4_ = fStack_2a18 * auVar105._8_4_;
                            auVar27._12_4_ = fStack_2a14 * auVar105._12_4_;
                            auVar27._16_4_ = fStack_2a10 * auVar105._16_4_;
                            auVar27._20_4_ = fStack_2a0c * auVar105._20_4_;
                            auVar27._24_4_ = fStack_2a08 * auVar105._24_4_;
                            auVar27._28_4_ = auVar105._28_4_;
                            auVar105 = vsubps_avx(auVar128,auVar74);
                            auVar28._4_4_ = local_2a60._4_4_ * auVar105._4_4_;
                            auVar28._0_4_ = local_2a60._0_4_ * auVar105._0_4_;
                            auVar28._8_4_ = local_2a60._8_4_ * auVar105._8_4_;
                            auVar28._12_4_ = local_2a60._12_4_ * auVar105._12_4_;
                            auVar28._16_4_ = local_2a60._16_4_ * auVar105._16_4_;
                            auVar28._20_4_ = local_2a60._20_4_ * auVar105._20_4_;
                            auVar28._24_4_ = local_2a60._24_4_ * auVar105._24_4_;
                            auVar28._28_4_ = auVar105._28_4_;
                            auVar105 = vsubps_avx(auVar169,auVar76);
                            auVar29._4_4_ = (float)local_2a40._4_4_ * auVar105._4_4_;
                            auVar29._0_4_ = (float)local_2a40._0_4_ * auVar105._0_4_;
                            auVar29._8_4_ = fStack_2a38 * auVar105._8_4_;
                            auVar29._12_4_ = fStack_2a34 * auVar105._12_4_;
                            auVar29._16_4_ = fStack_2a30 * auVar105._16_4_;
                            auVar29._20_4_ = fStack_2a2c * auVar105._20_4_;
                            auVar29._24_4_ = fStack_2a28 * auVar105._24_4_;
                            auVar29._28_4_ = auVar105._28_4_;
                            auVar105 = vsubps_avx(auVar204,auVar78);
                            auVar30._4_4_ = (float)local_2a20._4_4_ * auVar105._4_4_;
                            auVar30._0_4_ = (float)local_2a20._0_4_ * auVar105._0_4_;
                            auVar30._8_4_ = fStack_2a18 * auVar105._8_4_;
                            auVar30._12_4_ = fStack_2a14 * auVar105._12_4_;
                            auVar30._16_4_ = fStack_2a10 * auVar105._16_4_;
                            auVar30._20_4_ = fStack_2a0c * auVar105._20_4_;
                            auVar30._24_4_ = fStack_2a08 * auVar105._24_4_;
                            auVar30._28_4_ = auVar105._28_4_;
                            auVar105 = vminps_avx(auVar25,auVar28);
                            auVar125 = vminps_avx(auVar26,auVar29);
                            auVar105 = vmaxps_avx(auVar105,auVar125);
                            auVar125 = vminps_avx(auVar27,auVar30);
                            auVar105 = vmaxps_avx(auVar105,auVar125);
                            auVar31._4_4_ = auVar105._4_4_ * 0.99999964;
                            auVar31._0_4_ = auVar105._0_4_ * 0.99999964;
                            auVar31._8_4_ = auVar105._8_4_ * 0.99999964;
                            auVar31._12_4_ = auVar105._12_4_ * 0.99999964;
                            auVar31._16_4_ = auVar105._16_4_ * 0.99999964;
                            auVar31._20_4_ = auVar105._20_4_ * 0.99999964;
                            auVar31._24_4_ = auVar105._24_4_ * 0.99999964;
                            auVar31._28_4_ = auVar105._28_4_;
                            auVar105 = vmaxps_avx(auVar25,auVar28);
                            auVar125 = vmaxps_avx(auVar26,auVar29);
                            auVar125 = vminps_avx(auVar105,auVar125);
                            auVar105 = vmaxps_avx(auVar27,auVar30);
                            auVar105 = vminps_avx(auVar125,auVar105);
                            auVar32._4_4_ = auVar105._4_4_ * 1.0000004;
                            auVar32._0_4_ = auVar105._0_4_ * 1.0000004;
                            auVar32._8_4_ = auVar105._8_4_ * 1.0000004;
                            auVar32._12_4_ = auVar105._12_4_ * 1.0000004;
                            auVar32._16_4_ = auVar105._16_4_ * 1.0000004;
                            auVar32._20_4_ = auVar105._20_4_ * 1.0000004;
                            auVar32._24_4_ = auVar105._24_4_ * 1.0000004;
                            auVar32._28_4_ = auVar105._28_4_;
                            auVar105 = vmaxps_avx(auVar31,local_29a0);
                            auVar125 = vminps_avx(auVar32,local_2980);
                            auVar105 = vcmpps_avx(auVar105,auVar125,2);
                            auVar105 = local_2d00 & auVar105;
                            local_2db8 = uVar81;
                            if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar105 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar105 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar105 >> 0x7f,0) == '\0') &&
                                  (auVar105 & (undefined1  [32])0x100000000) ==
                                  (undefined1  [32])0x0) && SUB321(auVar105 >> 0xbf,0) == '\0') &&
                                (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar105[0x1f]) {
                              bVar100 = false;
                            }
                            else {
                              uVar1 = *(ushort *)(unaff_RBX + lVar85 * 8);
                              local_2ec4 = (uint)*(ushort *)(unaff_RBX + 2 + lVar85 * 8);
                              uVar86 = *(uint *)(unaff_RBX + 0x88);
                              uVar2 = *(uint *)(unaff_RBX + 4 + lVar85 * 8);
                              local_2e48 = (ulong)uVar2;
                              local_2ca0 = local_2d00;
                              uVar80 = vmovmskps_avx(local_2d00);
                              if (uVar80 != 0) {
                                uVar81 = (ulong)(uVar80 & 0xff);
                                local_2ea4 = uVar1 & 0x7fff;
                                local_2ea8 = local_2ec4 & 0x7fff;
                                local_2da8 = (ulong)(-1 < (short)uVar1);
                                auVar103 = vpshufd_avx(ZEXT416(local_2ea4),0);
                                auVar103 = vpaddd_avx(auVar103,_DAT_0201c990);
                                auVar102 = vpshufd_avx(ZEXT416(local_2ea8),0);
                                auVar102 = vpaddd_avx(auVar102,_DAT_0201c9a0);
                                auVar112._16_16_ = auVar103;
                                auVar112._0_16_ = auVar103;
                                _local_2740 = vcvtdq2ps_avx(auVar112);
                                auVar113._16_16_ = auVar102;
                                auVar113._0_16_ = auVar102;
                                _local_2760 = vcvtdq2ps_avx(auVar113);
                                auVar103 = vpshufd_avx(ZEXT416(uVar86),0);
                                local_2800._16_16_ = auVar103;
                                local_2800._0_16_ = auVar103;
                                auVar103 = vshufps_avx(ZEXT416(uVar2),ZEXT416(uVar2),0);
                                local_2820._16_16_ = auVar103;
                                local_2820._0_16_ = auVar103;
                                pRVar96 = ray;
                                pRVar98 = context;
                                uVar84 = (ulong)uVar86;
                                local_2da0 = (ulong)uVar86;
                                do {
                                  uVar79 = local_2da0;
                                  ray = local_2db0;
                                  context = local_2e50;
                                  unaff_RBX = local_2eb8;
                                  uVar97 = local_2ec0;
                                  local_2e20._0_8_ = uVar81;
                                  lVar85 = 0;
                                  if (uVar81 != 0) {
                                    for (; (uVar81 >> lVar85 & 1) == 0; lVar85 = lVar85 + 1) {
                                    }
                                  }
                                  local_2d88 = pRVar98->scene;
                                  pGVar95 = (local_2d88->geometries).items[uVar84].ptr;
                                  local_2d90 = *(long *)&pGVar95->field_0x58;
                                  fVar206 = (pGVar95->time_range).lower;
                                  auVar114._4_4_ = fVar206;
                                  auVar114._0_4_ = fVar206;
                                  auVar114._8_4_ = fVar206;
                                  auVar114._12_4_ = fVar206;
                                  auVar114._16_4_ = fVar206;
                                  auVar114._20_4_ = fVar206;
                                  auVar114._24_4_ = fVar206;
                                  auVar114._28_4_ = fVar206;
                                  local_2d98 = pGVar95[1].super_RefCount.refCounter.
                                               super___atomic_base<unsigned_long>._M_i * local_2e48;
                                  fVar213 = pGVar95->fnumTimeSegments;
                                  auVar105 = vsubps_avx(*(undefined1 (*) [32])(pRVar96 + 0xe0),
                                                        auVar114);
                                  auVar103 = ZEXT416((uint)((pGVar95->time_range).upper - fVar206));
                                  auVar103 = vshufps_avx(auVar103,auVar103,0);
                                  auVar115._16_16_ = auVar103;
                                  auVar115._0_16_ = auVar103;
                                  auVar105 = vdivps_avx(auVar105,auVar115);
                                  auVar33._4_4_ = fVar213 * auVar105._4_4_;
                                  auVar33._0_4_ = fVar213 * auVar105._0_4_;
                                  auVar33._8_4_ = fVar213 * auVar105._8_4_;
                                  auVar33._12_4_ = fVar213 * auVar105._12_4_;
                                  auVar33._16_4_ = fVar213 * auVar105._16_4_;
                                  auVar33._20_4_ = fVar213 * auVar105._20_4_;
                                  auVar33._24_4_ = fVar213 * auVar105._24_4_;
                                  auVar33._28_4_ = auVar105._28_4_;
                                  auVar105 = vroundps_avx(auVar33,1);
                                  auVar103 = vshufps_avx(ZEXT416((uint)(fVar213 + -1.0)),
                                                         ZEXT416((uint)(fVar213 + -1.0)),0);
                                  auVar149._16_16_ = auVar103;
                                  auVar149._0_16_ = auVar103;
                                  auVar105 = vminps_avx(auVar105,auVar149);
                                  auVar105 = vmaxps_avx(auVar105,_DAT_02020f00);
                                  local_2640 = vsubps_avx(auVar33,auVar105);
                                  local_2660 = vcvtps2dq_avx(auVar105);
                                  uVar86 = *(uint *)(local_2d90 + 4 + local_2d98);
                                  uVar84 = (ulong)uVar86;
                                  uVar90 = (ulong)(uVar86 * local_2ea8 +
                                                  *(int *)(local_2d90 + local_2d98) + local_2ea4);
                                  lVar3 = *(long *)&pGVar95[2].numPrimitives;
                                  lVar89 = (long)*(int *)(local_2660 + lVar85 * 4) * 0x38;
                                  lVar4 = *(long *)(lVar3 + lVar89);
                                  lVar5 = *(long *)(lVar3 + 0x10 + lVar89);
                                  lVar6 = *(long *)(lVar3 + 0x48 + lVar89);
                                  auVar103 = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar90);
                                  auVar102 = *(undefined1 (*) [16])(lVar4 + (uVar90 + 1) * lVar5);
                                  lVar82 = uVar90 + uVar84;
                                  auVar162 = *(undefined1 (*) [16])(lVar4 + lVar82 * lVar5);
                                  lVar99 = uVar90 + uVar84 + 1;
                                  auVar161 = *(undefined1 (*) [16])(lVar4 + lVar99 * lVar5);
                                  lVar83 = uVar90 + local_2da8 + 1;
                                  auVar142 = *(undefined1 (*) [16])(lVar4 + lVar83 * lVar5);
                                  lVar87 = local_2da8 + lVar99;
                                  auVar143 = *(undefined1 (*) [16])(lVar4 + lVar87 * lVar5);
                                  uVar94 = 0;
                                  if (-1 < (short)local_2ec4) {
                                    uVar94 = uVar84;
                                  }
                                  auVar163 = *(undefined1 (*) [16])
                                              (lVar4 + (lVar82 + uVar94) * lVar5);
                                  auVar182 = *(undefined1 (*) [16])
                                              (lVar4 + (lVar99 + uVar94) * lVar5);
                                  auVar183 = *(undefined1 (*) [16])
                                              (lVar4 + lVar5 * (uVar94 + lVar87));
                                  lVar3 = *(long *)(lVar3 + 0x38 + lVar89);
                                  fVar206 = *(float *)(local_2640 + lVar85 * 4);
                                  auVar197 = vsubps_avx(*(undefined1 (*) [16])
                                                         (lVar3 + lVar6 * uVar90),auVar103);
                                  auVar144._0_4_ = fVar206 * auVar197._0_4_ + auVar103._0_4_;
                                  auVar144._4_4_ = fVar206 * auVar197._4_4_ + auVar103._4_4_;
                                  auVar144._8_4_ = fVar206 * auVar197._8_4_ + auVar103._8_4_;
                                  auVar144._12_4_ = fVar206 * auVar197._12_4_ + auVar103._12_4_;
                                  auVar103 = vsubps_avx(*(undefined1 (*) [16])
                                                         (lVar3 + lVar6 * (uVar90 + 1)),auVar102);
                                  auVar254._0_4_ = fVar206 * auVar103._0_4_ + auVar102._0_4_;
                                  auVar254._4_4_ = fVar206 * auVar103._4_4_ + auVar102._4_4_;
                                  auVar254._8_4_ = fVar206 * auVar103._8_4_ + auVar102._8_4_;
                                  auVar254._12_4_ = fVar206 * auVar103._12_4_ + auVar102._12_4_;
                                  auVar103 = vsubps_avx(*(undefined1 (*) [16])
                                                         (lVar3 + lVar6 * lVar82),auVar162);
                                  auVar104._0_4_ = fVar206 * auVar103._0_4_ + auVar162._0_4_;
                                  auVar104._4_4_ = fVar206 * auVar103._4_4_ + auVar162._4_4_;
                                  auVar104._8_4_ = fVar206 * auVar103._8_4_ + auVar162._8_4_;
                                  auVar104._12_4_ = fVar206 * auVar103._12_4_ + auVar162._12_4_;
                                  auVar103 = vsubps_avx(*(undefined1 (*) [16])
                                                         (lVar3 + lVar6 * lVar99),auVar161);
                                  auVar123._0_4_ = fVar206 * auVar103._0_4_ + auVar161._0_4_;
                                  auVar123._4_4_ = fVar206 * auVar103._4_4_ + auVar161._4_4_;
                                  auVar123._8_4_ = fVar206 * auVar103._8_4_ + auVar161._8_4_;
                                  auVar123._12_4_ = fVar206 * auVar103._12_4_ + auVar161._12_4_;
                                  auVar103 = vsubps_avx(*(undefined1 (*) [16])
                                                         (lVar3 + lVar6 * lVar83),auVar142);
                                  auVar184._0_4_ = fVar206 * auVar103._0_4_ + auVar142._0_4_;
                                  auVar184._4_4_ = fVar206 * auVar103._4_4_ + auVar142._4_4_;
                                  auVar184._8_4_ = fVar206 * auVar103._8_4_ + auVar142._8_4_;
                                  auVar184._12_4_ = fVar206 * auVar103._12_4_ + auVar142._12_4_;
                                  auVar103 = vsubps_avx(*(undefined1 (*) [16])
                                                         (lVar3 + lVar6 * lVar87),auVar143);
                                  auVar199._0_4_ = fVar206 * auVar103._0_4_ + auVar143._0_4_;
                                  auVar199._4_4_ = fVar206 * auVar103._4_4_ + auVar143._4_4_;
                                  auVar199._8_4_ = fVar206 * auVar103._8_4_ + auVar143._8_4_;
                                  auVar199._12_4_ = fVar206 * auVar103._12_4_ + auVar143._12_4_;
                                  auVar103 = vsubps_avx(*(undefined1 (*) [16])
                                                         (lVar3 + lVar6 * (lVar82 + uVar94)),
                                                        auVar163);
                                  auVar164._0_4_ = auVar163._0_4_ + fVar206 * auVar103._0_4_;
                                  auVar164._4_4_ = auVar163._4_4_ + fVar206 * auVar103._4_4_;
                                  auVar164._8_4_ = auVar163._8_4_ + fVar206 * auVar103._8_4_;
                                  auVar164._12_4_ = auVar163._12_4_ + fVar206 * auVar103._12_4_;
                                  auVar103 = vsubps_avx(*(undefined1 (*) [16])
                                                         (lVar3 + lVar6 * (lVar99 + uVar94)),
                                                        auVar182);
                                  auVar209._0_4_ = auVar182._0_4_ + fVar206 * auVar103._0_4_;
                                  auVar209._4_4_ = auVar182._4_4_ + fVar206 * auVar103._4_4_;
                                  auVar209._8_4_ = auVar182._8_4_ + fVar206 * auVar103._8_4_;
                                  auVar209._12_4_ = auVar182._12_4_ + fVar206 * auVar103._12_4_;
                                  auVar103 = vsubps_avx(*(undefined1 (*) [16])
                                                         (lVar3 + (uVar94 + lVar87) * lVar6),
                                                        auVar183);
                                  auVar224._0_4_ = auVar183._0_4_ + fVar206 * auVar103._0_4_;
                                  auVar224._4_4_ = auVar183._4_4_ + fVar206 * auVar103._4_4_;
                                  auVar224._8_4_ = auVar183._8_4_ + fVar206 * auVar103._8_4_;
                                  auVar224._12_4_ = auVar183._12_4_ + fVar206 * auVar103._12_4_;
                                  auVar161 = vunpcklps_avx(auVar144,auVar123);
                                  auVar103 = vunpckhps_avx(auVar144,auVar123);
                                  auVar142 = vunpcklps_avx(auVar254,auVar104);
                                  auVar102 = vunpckhps_avx(auVar254,auVar104);
                                  auVar162 = vunpcklps_avx(auVar103,auVar102);
                                  auVar163 = vunpcklps_avx(auVar161,auVar142);
                                  auVar103 = vunpckhps_avx(auVar161,auVar142);
                                  auVar142 = vunpcklps_avx(auVar254,auVar199);
                                  auVar102 = vunpckhps_avx(auVar254,auVar199);
                                  auVar143 = vunpcklps_avx(auVar184,auVar123);
                                  auVar161 = vunpckhps_avx(auVar184,auVar123);
                                  auVar182 = vunpcklps_avx(auVar102,auVar161);
                                  auVar183 = vunpcklps_avx(auVar142,auVar143);
                                  auVar102 = vunpckhps_avx(auVar142,auVar143);
                                  auVar143 = vunpcklps_avx(auVar123,auVar224);
                                  auVar161 = vunpckhps_avx(auVar123,auVar224);
                                  auVar197 = vunpcklps_avx(auVar199,auVar209);
                                  auVar142 = vunpckhps_avx(auVar199,auVar209);
                                  auVar198 = vunpcklps_avx(auVar161,auVar142);
                                  auVar208 = vunpcklps_avx(auVar143,auVar197);
                                  auVar161 = vunpckhps_avx(auVar143,auVar197);
                                  auVar197 = vunpcklps_avx(auVar104,auVar209);
                                  auVar142 = vunpckhps_avx(auVar104,auVar209);
                                  auVar222 = vunpcklps_avx(auVar123,auVar164);
                                  auVar143 = vunpckhps_avx(auVar123,auVar164);
                                  auVar143 = vunpcklps_avx(auVar142,auVar143);
                                  auVar223 = vunpcklps_avx(auVar197,auVar222);
                                  auVar142 = vunpckhps_avx(auVar197,auVar222);
                                  auVar212._16_16_ = auVar208;
                                  auVar212._0_16_ = auVar163;
                                  auVar227._16_16_ = auVar161;
                                  auVar227._0_16_ = auVar103;
                                  auVar150._16_16_ = auVar198;
                                  auVar150._0_16_ = auVar162;
                                  auVar245._16_16_ = auVar183;
                                  auVar245._0_16_ = auVar183;
                                  auVar255._16_16_ = auVar102;
                                  auVar255._0_16_ = auVar102;
                                  auVar189._16_16_ = auVar182;
                                  auVar189._0_16_ = auVar182;
                                  auVar263._16_16_ = auVar223;
                                  auVar263._0_16_ = auVar223;
                                  auVar170._16_16_ = auVar142;
                                  auVar170._0_16_ = auVar142;
                                  auVar304._16_16_ = auVar143;
                                  auVar304._0_16_ = auVar143;
                                  local_2c20 = &local_2ee1;
                                  uVar91 = *(undefined4 *)(local_2db0 + lVar85 * 4);
                                  auVar279._4_4_ = uVar91;
                                  auVar279._0_4_ = uVar91;
                                  auVar279._8_4_ = uVar91;
                                  auVar279._12_4_ = uVar91;
                                  auVar279._16_4_ = uVar91;
                                  auVar279._20_4_ = uVar91;
                                  auVar279._24_4_ = uVar91;
                                  auVar279._28_4_ = uVar91;
                                  uVar91 = *(undefined4 *)(local_2db0 + lVar85 * 4 + 0x20);
                                  auVar287._4_4_ = uVar91;
                                  auVar287._0_4_ = uVar91;
                                  auVar287._8_4_ = uVar91;
                                  auVar287._12_4_ = uVar91;
                                  auVar287._16_4_ = uVar91;
                                  auVar287._20_4_ = uVar91;
                                  auVar287._24_4_ = uVar91;
                                  auVar287._28_4_ = uVar91;
                                  uVar91 = *(undefined4 *)(local_2db0 + lVar85 * 4 + 0x40);
                                  auVar290._4_4_ = uVar91;
                                  auVar290._0_4_ = uVar91;
                                  auVar290._8_4_ = uVar91;
                                  auVar290._12_4_ = uVar91;
                                  auVar290._16_4_ = uVar91;
                                  auVar290._20_4_ = uVar91;
                                  auVar290._24_4_ = uVar91;
                                  auVar290._28_4_ = uVar91;
                                  local_2cc0 = vsubps_avx(auVar212,auVar279);
                                  local_2ce0 = vsubps_avx(auVar227,auVar287);
                                  local_2680 = vsubps_avx(auVar150,auVar290);
                                  auVar105 = vsubps_avx(auVar245,auVar279);
                                  auVar125 = vsubps_avx(auVar255,auVar287);
                                  auVar166 = vsubps_avx(auVar189,auVar290);
                                  auVar165 = vsubps_avx(auVar263,auVar279);
                                  auVar185 = vsubps_avx(auVar170,auVar287);
                                  auVar200 = vsubps_avx(auVar304,auVar290);
                                  local_26a0 = vsubps_avx(auVar165,local_2cc0);
                                  local_26c0 = vsubps_avx(auVar185,local_2ce0);
                                  local_26e0 = vsubps_avx(auVar200,local_2680);
                                  fVar155 = local_2ce0._0_4_;
                                  fVar206 = auVar185._0_4_ + fVar155;
                                  fVar158 = local_2ce0._4_4_;
                                  fVar213 = auVar185._4_4_ + fVar158;
                                  fVar173 = local_2ce0._8_4_;
                                  fVar214 = auVar185._8_4_ + fVar173;
                                  fVar176 = local_2ce0._12_4_;
                                  fVar215 = auVar185._12_4_ + fVar176;
                                  fVar8 = local_2ce0._16_4_;
                                  fVar216 = auVar185._16_4_ + fVar8;
                                  fVar11 = local_2ce0._20_4_;
                                  fVar217 = auVar185._20_4_ + fVar11;
                                  fVar14 = local_2ce0._24_4_;
                                  fVar218 = auVar185._24_4_ + fVar14;
                                  fVar180 = local_2ce0._28_4_;
                                  fVar156 = local_2680._0_4_;
                                  fVar219 = auVar200._0_4_ + fVar156;
                                  fVar159 = local_2680._4_4_;
                                  fVar230 = auVar200._4_4_ + fVar159;
                                  fVar174 = local_2680._8_4_;
                                  fVar232 = auVar200._8_4_ + fVar174;
                                  fVar177 = local_2680._12_4_;
                                  fVar234 = auVar200._12_4_ + fVar177;
                                  fVar9 = local_2680._16_4_;
                                  fVar236 = auVar200._16_4_ + fVar9;
                                  fVar12 = local_2680._20_4_;
                                  fVar238 = auVar200._20_4_ + fVar12;
                                  fVar15 = local_2680._24_4_;
                                  fVar240 = auVar200._24_4_ + fVar15;
                                  fVar178 = auVar200._28_4_;
                                  fVar133 = local_26e0._0_4_;
                                  fVar134 = local_26e0._4_4_;
                                  auVar34._4_4_ = fVar213 * fVar134;
                                  auVar34._0_4_ = fVar206 * fVar133;
                                  fVar135 = local_26e0._8_4_;
                                  auVar34._8_4_ = fVar214 * fVar135;
                                  fVar136 = local_26e0._12_4_;
                                  auVar34._12_4_ = fVar215 * fVar136;
                                  fVar137 = local_26e0._16_4_;
                                  auVar34._16_4_ = fVar216 * fVar137;
                                  fVar138 = local_26e0._20_4_;
                                  auVar34._20_4_ = fVar217 * fVar138;
                                  fVar139 = local_26e0._24_4_;
                                  auVar34._24_4_ = fVar218 * fVar139;
                                  auVar34._28_4_ = auVar102._12_4_;
                                  fVar288 = local_26c0._0_4_;
                                  fVar291 = local_26c0._4_4_;
                                  auVar35._4_4_ = fVar291 * fVar230;
                                  auVar35._0_4_ = fVar288 * fVar219;
                                  fVar293 = local_26c0._8_4_;
                                  auVar35._8_4_ = fVar293 * fVar232;
                                  fVar295 = local_26c0._12_4_;
                                  auVar35._12_4_ = fVar295 * fVar234;
                                  fVar297 = local_26c0._16_4_;
                                  auVar35._16_4_ = fVar297 * fVar236;
                                  fVar299 = local_26c0._20_4_;
                                  auVar35._20_4_ = fVar299 * fVar238;
                                  fVar301 = local_26c0._24_4_;
                                  auVar35._24_4_ = fVar301 * fVar240;
                                  auVar35._28_4_ = auVar223._12_4_;
                                  auVar201 = vsubps_avx(auVar35,auVar34);
                                  fVar157 = local_2cc0._0_4_;
                                  fVar253 = auVar165._0_4_ + fVar157;
                                  fVar172 = local_2cc0._4_4_;
                                  fVar256 = auVar165._4_4_ + fVar172;
                                  fVar175 = local_2cc0._8_4_;
                                  fVar257 = auVar165._8_4_ + fVar175;
                                  fVar179 = local_2cc0._12_4_;
                                  fVar258 = auVar165._12_4_ + fVar179;
                                  fVar10 = local_2cc0._16_4_;
                                  fVar259 = auVar165._16_4_ + fVar10;
                                  fVar13 = local_2cc0._20_4_;
                                  fVar260 = auVar165._20_4_ + fVar13;
                                  fVar16 = local_2cc0._24_4_;
                                  fVar261 = auVar165._24_4_ + fVar16;
                                  fVar278 = local_26a0._0_4_;
                                  fVar280 = local_26a0._4_4_;
                                  auVar36._4_4_ = fVar280 * fVar230;
                                  auVar36._0_4_ = fVar278 * fVar219;
                                  fVar281 = local_26a0._8_4_;
                                  auVar36._8_4_ = fVar281 * fVar232;
                                  fVar282 = local_26a0._12_4_;
                                  auVar36._12_4_ = fVar282 * fVar234;
                                  fVar283 = local_26a0._16_4_;
                                  auVar36._16_4_ = fVar283 * fVar236;
                                  fVar284 = local_26a0._20_4_;
                                  auVar36._20_4_ = fVar284 * fVar238;
                                  fVar285 = local_26a0._24_4_;
                                  auVar36._24_4_ = fVar285 * fVar240;
                                  auVar36._28_4_ = fVar178 + local_2680._28_4_;
                                  auVar243 = local_26e0;
                                  auVar37._4_4_ = fVar256 * fVar134;
                                  auVar37._0_4_ = fVar253 * fVar133;
                                  auVar37._8_4_ = fVar257 * fVar135;
                                  auVar37._12_4_ = fVar258 * fVar136;
                                  auVar37._16_4_ = fVar259 * fVar137;
                                  auVar37._20_4_ = fVar260 * fVar138;
                                  auVar37._24_4_ = fVar261 * fVar139;
                                  auVar37._28_4_ = auVar223._12_4_;
                                  auVar202 = vsubps_avx(auVar37,auVar36);
                                  auVar38._4_4_ = fVar256 * fVar291;
                                  auVar38._0_4_ = fVar253 * fVar288;
                                  auVar38._8_4_ = fVar257 * fVar293;
                                  auVar38._12_4_ = fVar258 * fVar295;
                                  auVar38._16_4_ = fVar259 * fVar297;
                                  auVar38._20_4_ = fVar260 * fVar299;
                                  auVar38._24_4_ = fVar261 * fVar301;
                                  auVar38._28_4_ = auVar165._28_4_ + local_2cc0._28_4_;
                                  auVar39._4_4_ = fVar280 * fVar213;
                                  auVar39._0_4_ = fVar278 * fVar206;
                                  auVar39._8_4_ = fVar281 * fVar214;
                                  auVar39._12_4_ = fVar282 * fVar215;
                                  auVar39._16_4_ = fVar283 * fVar216;
                                  auVar39._20_4_ = fVar284 * fVar217;
                                  auVar39._24_4_ = fVar285 * fVar218;
                                  auVar39._28_4_ = auVar185._28_4_ + fVar180;
                                  auVar210 = vsubps_avx(auVar39,auVar38);
                                  fVar206 = *(float *)(local_2db0 + lVar85 * 4 + 0xa0);
                                  local_2e80._4_4_ = fVar206;
                                  local_2e80._0_4_ = fVar206;
                                  local_2e80._8_4_ = fVar206;
                                  local_2e80._12_4_ = fVar206;
                                  local_2e80._16_4_ = fVar206;
                                  local_2e80._20_4_ = fVar206;
                                  local_2e80._24_4_ = fVar206;
                                  local_2e80._28_4_ = fVar206;
                                  fVar213 = *(float *)(local_2db0 + lVar85 * 4 + 0xc0);
                                  local_2e40._4_4_ = fVar213;
                                  local_2e40._0_4_ = fVar213;
                                  local_2e40._8_4_ = fVar213;
                                  local_2e40._12_4_ = fVar213;
                                  local_2e40._16_4_ = fVar213;
                                  local_2e40._20_4_ = fVar213;
                                  local_2e40._24_4_ = fVar213;
                                  local_2e40._28_4_ = fVar213;
                                  auVar154 = ZEXT3264(local_2e40);
                                  local_2ea0._4_4_ = *(undefined4 *)(local_2db0 + lVar85 * 4 + 0x80)
                                  ;
                                  local_2ea0._0_4_ = local_2ea0._4_4_;
                                  uStack_2e98._0_4_ = local_2ea0._4_4_;
                                  uStack_2e98._4_4_ = local_2ea0._4_4_;
                                  uStack_2e90._0_4_ = local_2ea0._4_4_;
                                  uStack_2e90._4_4_ = local_2ea0._4_4_;
                                  uStack_2e88._0_4_ = local_2ea0._4_4_;
                                  uStack_2e88._4_4_ = local_2ea0._4_4_;
                                  local_2700._0_4_ =
                                       auVar201._0_4_ * (float)local_2ea0._4_4_ +
                                       auVar210._0_4_ * fVar213 + fVar206 * auVar202._0_4_;
                                  local_2700._4_4_ =
                                       auVar201._4_4_ * (float)local_2ea0._4_4_ +
                                       auVar210._4_4_ * fVar213 + fVar206 * auVar202._4_4_;
                                  local_2700._8_4_ =
                                       auVar201._8_4_ * (float)local_2ea0._4_4_ +
                                       auVar210._8_4_ * fVar213 + fVar206 * auVar202._8_4_;
                                  local_2700._12_4_ =
                                       auVar201._12_4_ * (float)local_2ea0._4_4_ +
                                       auVar210._12_4_ * fVar213 + fVar206 * auVar202._12_4_;
                                  local_2700._16_4_ =
                                       auVar201._16_4_ * (float)local_2ea0._4_4_ +
                                       auVar210._16_4_ * fVar213 + fVar206 * auVar202._16_4_;
                                  local_2700._20_4_ =
                                       auVar201._20_4_ * (float)local_2ea0._4_4_ +
                                       auVar210._20_4_ * fVar213 + fVar206 * auVar202._20_4_;
                                  local_2700._24_4_ =
                                       auVar201._24_4_ * (float)local_2ea0._4_4_ +
                                       auVar210._24_4_ * fVar213 + fVar206 * auVar202._24_4_;
                                  local_2700._28_4_ =
                                       auVar202._28_4_ + auVar210._28_4_ + auVar202._28_4_;
                                  auVar201 = vsubps_avx(local_2ce0,auVar125);
                                  auVar202 = vsubps_avx(local_2680,auVar166);
                                  fVar214 = fVar155 + auVar125._0_4_;
                                  fVar215 = fVar158 + auVar125._4_4_;
                                  fVar216 = fVar173 + auVar125._8_4_;
                                  fVar217 = fVar176 + auVar125._12_4_;
                                  fVar218 = fVar8 + auVar125._16_4_;
                                  fVar219 = fVar11 + auVar125._20_4_;
                                  fVar230 = fVar14 + auVar125._24_4_;
                                  fVar232 = auVar166._0_4_ + fVar156;
                                  fVar234 = auVar166._4_4_ + fVar159;
                                  fVar236 = auVar166._8_4_ + fVar174;
                                  fVar238 = auVar166._12_4_ + fVar177;
                                  fVar240 = auVar166._16_4_ + fVar9;
                                  fVar253 = auVar166._20_4_ + fVar12;
                                  fVar256 = auVar166._24_4_ + fVar15;
                                  fVar303 = auVar202._0_4_;
                                  fVar305 = auVar202._4_4_;
                                  auVar40._4_4_ = fVar305 * fVar215;
                                  auVar40._0_4_ = fVar303 * fVar214;
                                  fVar306 = auVar202._8_4_;
                                  auVar40._8_4_ = fVar306 * fVar216;
                                  fVar307 = auVar202._12_4_;
                                  auVar40._12_4_ = fVar307 * fVar217;
                                  fVar308 = auVar202._16_4_;
                                  auVar40._16_4_ = fVar308 * fVar218;
                                  fVar309 = auVar202._20_4_;
                                  auVar40._20_4_ = fVar309 * fVar219;
                                  fVar310 = auVar202._24_4_;
                                  auVar40._24_4_ = fVar310 * fVar230;
                                  auVar40._28_4_ = local_26c0._28_4_;
                                  fVar264 = auVar201._0_4_;
                                  fVar266 = auVar201._4_4_;
                                  auVar41._4_4_ = fVar266 * fVar234;
                                  auVar41._0_4_ = fVar264 * fVar232;
                                  fVar268 = auVar201._8_4_;
                                  auVar41._8_4_ = fVar268 * fVar236;
                                  fVar270 = auVar201._12_4_;
                                  auVar41._12_4_ = fVar270 * fVar238;
                                  fVar272 = auVar201._16_4_;
                                  auVar41._16_4_ = fVar272 * fVar240;
                                  fVar274 = auVar201._20_4_;
                                  auVar41._20_4_ = fVar274 * fVar253;
                                  fVar276 = auVar201._24_4_;
                                  auVar41._24_4_ = fVar276 * fVar256;
                                  auVar41._28_4_ = fVar180;
                                  auVar201 = vsubps_avx(auVar41,auVar40);
                                  auVar202 = vsubps_avx(local_2cc0,auVar105);
                                  fVar289 = auVar202._0_4_;
                                  fVar292 = auVar202._4_4_;
                                  auVar42._4_4_ = fVar292 * fVar234;
                                  auVar42._0_4_ = fVar289 * fVar232;
                                  fVar294 = auVar202._8_4_;
                                  auVar42._8_4_ = fVar294 * fVar236;
                                  fVar296 = auVar202._12_4_;
                                  auVar42._12_4_ = fVar296 * fVar238;
                                  fVar298 = auVar202._16_4_;
                                  auVar42._16_4_ = fVar298 * fVar240;
                                  fVar300 = auVar202._20_4_;
                                  auVar42._20_4_ = fVar300 * fVar253;
                                  fVar302 = auVar202._24_4_;
                                  auVar42._24_4_ = fVar302 * fVar256;
                                  auVar42._28_4_ = auVar166._28_4_ + local_2680._28_4_;
                                  fVar232 = auVar105._0_4_ + fVar157;
                                  fVar234 = auVar105._4_4_ + fVar172;
                                  fVar236 = auVar105._8_4_ + fVar175;
                                  fVar238 = auVar105._12_4_ + fVar179;
                                  fVar240 = auVar105._16_4_ + fVar10;
                                  fVar253 = auVar105._20_4_ + fVar13;
                                  fVar256 = auVar105._24_4_ + fVar16;
                                  fVar286 = auVar105._28_4_;
                                  auVar43._4_4_ = fVar234 * fVar305;
                                  auVar43._0_4_ = fVar232 * fVar303;
                                  auVar43._8_4_ = fVar236 * fVar306;
                                  auVar43._12_4_ = fVar238 * fVar307;
                                  auVar43._16_4_ = fVar240 * fVar308;
                                  auVar43._20_4_ = fVar253 * fVar309;
                                  auVar43._24_4_ = fVar256 * fVar310;
                                  auVar43._28_4_ = fVar286;
                                  auVar210 = vsubps_avx(auVar43,auVar42);
                                  auVar44._4_4_ = fVar234 * fVar266;
                                  auVar44._0_4_ = fVar232 * fVar264;
                                  auVar44._8_4_ = fVar236 * fVar268;
                                  auVar44._12_4_ = fVar238 * fVar270;
                                  auVar44._16_4_ = fVar240 * fVar272;
                                  auVar44._20_4_ = fVar253 * fVar274;
                                  auVar44._24_4_ = fVar256 * fVar276;
                                  auVar44._28_4_ = fVar286 + local_2cc0._28_4_;
                                  auVar45._4_4_ = fVar292 * fVar215;
                                  auVar45._0_4_ = fVar289 * fVar214;
                                  auVar45._8_4_ = fVar294 * fVar216;
                                  auVar45._12_4_ = fVar296 * fVar217;
                                  auVar45._16_4_ = fVar298 * fVar218;
                                  auVar45._20_4_ = fVar300 * fVar219;
                                  auVar45._24_4_ = fVar302 * fVar230;
                                  auVar45._28_4_ = fVar180 + auVar125._28_4_;
                                  auVar225 = vsubps_avx(auVar45,auVar44);
                                  fVar180 = auVar201._28_4_;
                                  local_2720._0_4_ =
                                       (float)local_2ea0._4_4_ * auVar201._0_4_ +
                                       auVar225._0_4_ * fVar213 + fVar206 * auVar210._0_4_;
                                  local_2720._4_4_ =
                                       (float)local_2ea0._4_4_ * auVar201._4_4_ +
                                       auVar225._4_4_ * fVar213 + fVar206 * auVar210._4_4_;
                                  local_2720._8_4_ =
                                       (float)local_2ea0._4_4_ * auVar201._8_4_ +
                                       auVar225._8_4_ * fVar213 + fVar206 * auVar210._8_4_;
                                  local_2720._12_4_ =
                                       (float)local_2ea0._4_4_ * auVar201._12_4_ +
                                       auVar225._12_4_ * fVar213 + fVar206 * auVar210._12_4_;
                                  local_2720._16_4_ =
                                       (float)local_2ea0._4_4_ * auVar201._16_4_ +
                                       auVar225._16_4_ * fVar213 + fVar206 * auVar210._16_4_;
                                  local_2720._20_4_ =
                                       (float)local_2ea0._4_4_ * auVar201._20_4_ +
                                       auVar225._20_4_ * fVar213 + fVar206 * auVar210._20_4_;
                                  local_2720._24_4_ =
                                       (float)local_2ea0._4_4_ * auVar201._24_4_ +
                                       auVar225._24_4_ * fVar213 + fVar206 * auVar210._24_4_;
                                  local_2720._28_4_ = fVar180 + auVar225._28_4_ + auVar210._28_4_;
                                  auVar201 = vsubps_avx(auVar105,auVar165);
                                  fVar257 = auVar105._0_4_ + auVar165._0_4_;
                                  fVar258 = auVar105._4_4_ + auVar165._4_4_;
                                  fVar259 = auVar105._8_4_ + auVar165._8_4_;
                                  fVar260 = auVar105._12_4_ + auVar165._12_4_;
                                  fVar261 = auVar105._16_4_ + auVar165._16_4_;
                                  fVar194 = auVar105._20_4_ + auVar165._20_4_;
                                  fVar195 = auVar105._24_4_ + auVar165._24_4_;
                                  auVar105 = vsubps_avx(auVar125,auVar185);
                                  fVar232 = auVar185._0_4_ + auVar125._0_4_;
                                  fVar234 = auVar185._4_4_ + auVar125._4_4_;
                                  fVar236 = auVar185._8_4_ + auVar125._8_4_;
                                  fVar238 = auVar185._12_4_ + auVar125._12_4_;
                                  fVar240 = auVar185._16_4_ + auVar125._16_4_;
                                  fVar253 = auVar185._20_4_ + auVar125._20_4_;
                                  fVar256 = auVar185._24_4_ + auVar125._24_4_;
                                  auVar210 = vsubps_avx(auVar166,auVar200);
                                  fVar214 = auVar166._0_4_ + auVar200._0_4_;
                                  fVar215 = auVar166._4_4_ + auVar200._4_4_;
                                  fVar216 = auVar166._8_4_ + auVar200._8_4_;
                                  fVar217 = auVar166._12_4_ + auVar200._12_4_;
                                  fVar218 = auVar166._16_4_ + auVar200._16_4_;
                                  fVar219 = auVar166._20_4_ + auVar200._20_4_;
                                  fVar230 = auVar166._24_4_ + auVar200._24_4_;
                                  fVar242 = auVar210._0_4_;
                                  fVar247 = auVar210._4_4_;
                                  auVar46._4_4_ = fVar247 * fVar234;
                                  auVar46._0_4_ = fVar242 * fVar232;
                                  fVar248 = auVar210._8_4_;
                                  auVar46._8_4_ = fVar248 * fVar236;
                                  fVar249 = auVar210._12_4_;
                                  auVar46._12_4_ = fVar249 * fVar238;
                                  fVar250 = auVar210._16_4_;
                                  auVar46._16_4_ = fVar250 * fVar240;
                                  fVar251 = auVar210._20_4_;
                                  auVar46._20_4_ = fVar251 * fVar253;
                                  fVar252 = auVar210._24_4_;
                                  auVar46._24_4_ = fVar252 * fVar256;
                                  auVar46._28_4_ = fVar178;
                                  fVar265 = auVar105._0_4_;
                                  fVar267 = auVar105._4_4_;
                                  auVar47._4_4_ = fVar267 * fVar215;
                                  auVar47._0_4_ = fVar265 * fVar214;
                                  fVar269 = auVar105._8_4_;
                                  auVar47._8_4_ = fVar269 * fVar216;
                                  fVar271 = auVar105._12_4_;
                                  auVar47._12_4_ = fVar271 * fVar217;
                                  fVar273 = auVar105._16_4_;
                                  auVar47._16_4_ = fVar273 * fVar218;
                                  fVar275 = auVar105._20_4_;
                                  auVar47._20_4_ = fVar275 * fVar219;
                                  fVar277 = auVar105._24_4_;
                                  auVar47._24_4_ = fVar277 * fVar230;
                                  auVar47._28_4_ = fVar180;
                                  auVar105 = vsubps_avx(auVar47,auVar46);
                                  fVar220 = auVar201._0_4_;
                                  fVar231 = auVar201._4_4_;
                                  auVar48._4_4_ = fVar231 * fVar215;
                                  auVar48._0_4_ = fVar220 * fVar214;
                                  fVar233 = auVar201._8_4_;
                                  auVar48._8_4_ = fVar233 * fVar216;
                                  fVar235 = auVar201._12_4_;
                                  auVar48._12_4_ = fVar235 * fVar217;
                                  fVar237 = auVar201._16_4_;
                                  auVar48._16_4_ = fVar237 * fVar218;
                                  fVar239 = auVar201._20_4_;
                                  auVar48._20_4_ = fVar239 * fVar219;
                                  fVar241 = auVar201._24_4_;
                                  auVar48._24_4_ = fVar241 * fVar230;
                                  auVar48._28_4_ = auVar166._28_4_ + fVar178;
                                  auVar49._4_4_ = fVar247 * fVar258;
                                  auVar49._0_4_ = fVar242 * fVar257;
                                  auVar49._8_4_ = fVar248 * fVar259;
                                  auVar49._12_4_ = fVar249 * fVar260;
                                  auVar49._16_4_ = fVar250 * fVar261;
                                  auVar49._20_4_ = fVar251 * fVar194;
                                  auVar49._24_4_ = fVar252 * fVar195;
                                  auVar49._28_4_ = fVar180;
                                  auVar200 = vsubps_avx(auVar49,auVar48);
                                  auVar50._4_4_ = fVar267 * fVar258;
                                  auVar50._0_4_ = fVar265 * fVar257;
                                  auVar50._8_4_ = fVar269 * fVar259;
                                  auVar50._12_4_ = fVar271 * fVar260;
                                  auVar50._16_4_ = fVar273 * fVar261;
                                  auVar50._20_4_ = fVar275 * fVar194;
                                  auVar50._24_4_ = fVar277 * fVar195;
                                  auVar50._28_4_ = fVar286 + auVar165._28_4_;
                                  auVar51._4_4_ = fVar231 * fVar234;
                                  auVar51._0_4_ = fVar220 * fVar232;
                                  auVar51._8_4_ = fVar233 * fVar236;
                                  auVar51._12_4_ = fVar235 * fVar238;
                                  auVar51._16_4_ = fVar237 * fVar240;
                                  auVar51._20_4_ = fVar239 * fVar253;
                                  auVar51._24_4_ = fVar241 * fVar256;
                                  auVar51._28_4_ = auVar185._28_4_ + auVar125._28_4_;
                                  auVar125 = vsubps_avx(auVar51,auVar50);
                                  auVar129._0_4_ =
                                       (float)local_2ea0._4_4_ * auVar105._0_4_ +
                                       auVar125._0_4_ * fVar213 + fVar206 * auVar200._0_4_;
                                  auVar129._4_4_ =
                                       (float)local_2ea0._4_4_ * auVar105._4_4_ +
                                       auVar125._4_4_ * fVar213 + fVar206 * auVar200._4_4_;
                                  auVar129._8_4_ =
                                       (float)local_2ea0._4_4_ * auVar105._8_4_ +
                                       auVar125._8_4_ * fVar213 + fVar206 * auVar200._8_4_;
                                  auVar129._12_4_ =
                                       (float)local_2ea0._4_4_ * auVar105._12_4_ +
                                       auVar125._12_4_ * fVar213 + fVar206 * auVar200._12_4_;
                                  auVar129._16_4_ =
                                       (float)local_2ea0._4_4_ * auVar105._16_4_ +
                                       auVar125._16_4_ * fVar213 + fVar206 * auVar200._16_4_;
                                  auVar129._20_4_ =
                                       (float)local_2ea0._4_4_ * auVar105._20_4_ +
                                       auVar125._20_4_ * fVar213 + fVar206 * auVar200._20_4_;
                                  auVar129._24_4_ =
                                       (float)local_2ea0._4_4_ * auVar105._24_4_ +
                                       auVar125._24_4_ * fVar213 + fVar206 * auVar200._24_4_;
                                  auVar129._28_4_ =
                                       auVar125._28_4_ + auVar125._28_4_ + auVar200._28_4_;
                                  local_2d80._0_4_ =
                                       auVar129._0_4_ + local_2700._0_4_ + local_2720._0_4_;
                                  local_2d80._4_4_ =
                                       auVar129._4_4_ + local_2700._4_4_ + local_2720._4_4_;
                                  local_2d80._8_4_ =
                                       auVar129._8_4_ + local_2700._8_4_ + local_2720._8_4_;
                                  local_2d80._12_4_ =
                                       auVar129._12_4_ + local_2700._12_4_ + local_2720._12_4_;
                                  local_2d80._16_4_ =
                                       auVar129._16_4_ + local_2700._16_4_ + local_2720._16_4_;
                                  local_2d80._20_4_ =
                                       auVar129._20_4_ + local_2700._20_4_ + local_2720._20_4_;
                                  local_2d80._24_4_ =
                                       auVar129._24_4_ + local_2700._24_4_ + local_2720._24_4_;
                                  local_2d80._28_4_ =
                                       auVar129._28_4_ + local_2700._28_4_ + local_2720._28_4_;
                                  auVar105 = vminps_avx(local_2700,local_2720);
                                  auVar105 = vminps_avx(auVar105,auVar129);
                                  auVar190._8_4_ = 0x7fffffff;
                                  auVar190._0_8_ = 0x7fffffff7fffffff;
                                  auVar190._12_4_ = 0x7fffffff;
                                  auVar190._16_4_ = 0x7fffffff;
                                  auVar190._20_4_ = 0x7fffffff;
                                  auVar190._24_4_ = 0x7fffffff;
                                  auVar190._28_4_ = 0x7fffffff;
                                  local_27c0 = vandps_avx(local_2d80,auVar190);
                                  fVar180 = local_27c0._0_4_ * 1.1920929e-07;
                                  fVar214 = local_27c0._4_4_ * 1.1920929e-07;
                                  auVar52._4_4_ = fVar214;
                                  auVar52._0_4_ = fVar180;
                                  fVar215 = local_27c0._8_4_ * 1.1920929e-07;
                                  auVar52._8_4_ = fVar215;
                                  fVar216 = local_27c0._12_4_ * 1.1920929e-07;
                                  auVar52._12_4_ = fVar216;
                                  fVar217 = local_27c0._16_4_ * 1.1920929e-07;
                                  auVar52._16_4_ = fVar217;
                                  fVar218 = local_27c0._20_4_ * 1.1920929e-07;
                                  auVar52._20_4_ = fVar218;
                                  uVar86 = local_27c0._28_4_;
                                  fVar219 = local_27c0._24_4_ * 1.1920929e-07;
                                  auVar52._24_4_ = fVar219;
                                  auVar52._28_4_ = uVar86;
                                  auVar205._0_8_ = CONCAT44(fVar214,fVar180) ^ 0x8000000080000000;
                                  auVar205._8_4_ = -fVar215;
                                  auVar205._12_4_ = -fVar216;
                                  auVar205._16_4_ = -fVar217;
                                  auVar205._20_4_ = -fVar218;
                                  auVar205._24_4_ = -fVar219;
                                  auVar205._28_4_ = uVar86 ^ 0x80000000;
                                  auVar105 = vcmpps_avx(auVar105,auVar205,5);
                                  auVar165 = vmaxps_avx(local_2700,local_2720);
                                  auVar125 = vmaxps_avx(auVar165,auVar129);
                                  auVar125 = vcmpps_avx(auVar125,auVar52,2);
                                  auVar105 = vorps_avx(auVar105,auVar125);
                                  puVar92 = local_2ed0;
                                  pauVar93 = local_2ed8;
                                  uVar94 = local_2ee0;
                                  local_2eb0 = lVar85;
                                  local_26e0 = auVar243;
                                  if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (auVar105 >> 0x3f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar105 >> 0x5f & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         SUB321(auVar105 >> 0x7f,0) != '\0') ||
                                        (auVar105 & (undefined1  [32])0x100000000) !=
                                        (undefined1  [32])0x0) || SUB321(auVar105 >> 0xbf,0) != '\0'
                                       ) || (auVar105 & (undefined1  [32])0x100000000) !=
                                            (undefined1  [32])0x0) || auVar105[0x1f] < '\0') {
                                    auVar53._4_4_ = fVar266 * fVar134;
                                    auVar53._0_4_ = fVar264 * fVar133;
                                    auVar53._8_4_ = fVar268 * fVar135;
                                    auVar53._12_4_ = fVar270 * fVar136;
                                    auVar53._16_4_ = fVar272 * fVar137;
                                    auVar53._20_4_ = fVar274 * fVar138;
                                    auVar53._24_4_ = fVar276 * fVar139;
                                    auVar53._28_4_ = auVar125._28_4_;
                                    auVar54._4_4_ = fVar291 * fVar305;
                                    auVar54._0_4_ = fVar288 * fVar303;
                                    auVar54._8_4_ = fVar293 * fVar306;
                                    auVar54._12_4_ = fVar295 * fVar307;
                                    auVar54._16_4_ = fVar297 * fVar308;
                                    auVar54._20_4_ = fVar299 * fVar309;
                                    auVar54._24_4_ = fVar301 * fVar310;
                                    auVar54._28_4_ = uVar86;
                                    auVar166 = vsubps_avx(auVar54,auVar53);
                                    auVar55._4_4_ = fVar305 * fVar267;
                                    auVar55._0_4_ = fVar303 * fVar265;
                                    auVar55._8_4_ = fVar306 * fVar269;
                                    auVar55._12_4_ = fVar307 * fVar271;
                                    auVar55._16_4_ = fVar308 * fVar273;
                                    auVar55._20_4_ = fVar309 * fVar275;
                                    auVar55._24_4_ = fVar310 * fVar277;
                                    auVar55._28_4_ = auVar165._28_4_;
                                    auVar56._4_4_ = fVar266 * fVar247;
                                    auVar56._0_4_ = fVar264 * fVar242;
                                    auVar56._8_4_ = fVar268 * fVar248;
                                    auVar56._12_4_ = fVar270 * fVar249;
                                    auVar56._16_4_ = fVar272 * fVar250;
                                    auVar56._20_4_ = fVar274 * fVar251;
                                    auVar56._24_4_ = fVar276 * fVar252;
                                    auVar56._28_4_ = local_2d80._28_4_;
                                    auVar200 = vsubps_avx(auVar56,auVar55);
                                    auVar116._8_4_ = 0x7fffffff;
                                    auVar116._0_8_ = 0x7fffffff7fffffff;
                                    auVar116._12_4_ = 0x7fffffff;
                                    auVar116._16_4_ = 0x7fffffff;
                                    auVar116._20_4_ = 0x7fffffff;
                                    auVar116._24_4_ = 0x7fffffff;
                                    auVar116._28_4_ = 0x7fffffff;
                                    auVar125 = vandps_avx(auVar53,auVar116);
                                    auVar165 = vandps_avx(auVar55,auVar116);
                                    auVar125 = vcmpps_avx(auVar125,auVar165,1);
                                    auVar185 = vblendvps_avx(auVar200,auVar166,auVar125);
                                    auVar57._4_4_ = fVar292 * fVar247;
                                    auVar57._0_4_ = fVar289 * fVar242;
                                    auVar57._8_4_ = fVar294 * fVar248;
                                    auVar57._12_4_ = fVar296 * fVar249;
                                    auVar57._16_4_ = fVar298 * fVar250;
                                    auVar57._20_4_ = fVar300 * fVar251;
                                    auVar57._24_4_ = fVar302 * fVar252;
                                    auVar57._28_4_ = auVar166._28_4_;
                                    auVar58._4_4_ = fVar292 * fVar134;
                                    auVar58._0_4_ = fVar289 * fVar133;
                                    auVar58._8_4_ = fVar294 * fVar135;
                                    auVar58._12_4_ = fVar296 * fVar136;
                                    auVar58._16_4_ = fVar298 * fVar137;
                                    auVar58._20_4_ = fVar300 * fVar138;
                                    auVar58._24_4_ = fVar302 * fVar139;
                                    auVar58._28_4_ = auVar165._28_4_;
                                    auVar59._4_4_ = fVar280 * fVar305;
                                    auVar59._0_4_ = fVar278 * fVar303;
                                    auVar59._8_4_ = fVar281 * fVar306;
                                    auVar59._12_4_ = fVar282 * fVar307;
                                    auVar59._16_4_ = fVar283 * fVar308;
                                    auVar59._20_4_ = fVar284 * fVar309;
                                    auVar59._24_4_ = fVar285 * fVar310;
                                    auVar59._28_4_ = auVar210._28_4_;
                                    auVar166 = vsubps_avx(auVar58,auVar59);
                                    auVar60._4_4_ = fVar305 * fVar231;
                                    auVar60._0_4_ = fVar303 * fVar220;
                                    auVar60._8_4_ = fVar306 * fVar233;
                                    auVar60._12_4_ = fVar307 * fVar235;
                                    auVar60._16_4_ = fVar308 * fVar237;
                                    auVar60._20_4_ = fVar309 * fVar239;
                                    auVar60._24_4_ = fVar310 * fVar241;
                                    auVar60._28_4_ = auVar200._28_4_;
                                    auVar200 = vsubps_avx(auVar60,auVar57);
                                    auVar125 = vandps_avx(auVar59,auVar116);
                                    auVar165 = vandps_avx(auVar57,auVar116);
                                    auVar165 = vcmpps_avx(auVar125,auVar165,1);
                                    auVar200 = vblendvps_avx(auVar200,auVar166,auVar165);
                                    auVar61._4_4_ = fVar266 * fVar231;
                                    auVar61._0_4_ = fVar264 * fVar220;
                                    auVar61._8_4_ = fVar268 * fVar233;
                                    auVar61._12_4_ = fVar270 * fVar235;
                                    auVar61._16_4_ = fVar272 * fVar237;
                                    auVar61._20_4_ = fVar274 * fVar239;
                                    auVar61._24_4_ = fVar276 * fVar241;
                                    auVar61._28_4_ = auVar165._28_4_;
                                    auVar62._4_4_ = fVar280 * fVar266;
                                    auVar62._0_4_ = fVar278 * fVar264;
                                    auVar62._8_4_ = fVar281 * fVar268;
                                    auVar62._12_4_ = fVar282 * fVar270;
                                    auVar62._16_4_ = fVar283 * fVar272;
                                    auVar62._20_4_ = fVar284 * fVar274;
                                    auVar62._24_4_ = fVar285 * fVar276;
                                    auVar62._28_4_ = auVar166._28_4_;
                                    auVar63._4_4_ = fVar292 * fVar291;
                                    auVar63._0_4_ = fVar289 * fVar288;
                                    auVar63._8_4_ = fVar294 * fVar293;
                                    auVar63._12_4_ = fVar296 * fVar295;
                                    auVar63._16_4_ = fVar298 * fVar297;
                                    auVar63._20_4_ = fVar300 * fVar299;
                                    auVar63._24_4_ = fVar302 * fVar301;
                                    auVar63._28_4_ = auVar201._28_4_;
                                    auVar64._4_4_ = fVar292 * fVar267;
                                    auVar64._0_4_ = fVar289 * fVar265;
                                    auVar64._8_4_ = fVar294 * fVar269;
                                    auVar64._12_4_ = fVar296 * fVar271;
                                    auVar64._16_4_ = fVar298 * fVar273;
                                    auVar64._20_4_ = fVar300 * fVar275;
                                    auVar64._24_4_ = fVar302 * fVar277;
                                    auVar64._28_4_ = local_26e0._28_4_;
                                    auVar201 = vsubps_avx(auVar62,auVar63);
                                    auVar210 = vsubps_avx(auVar64,auVar61);
                                    auVar165 = vandps_avx(auVar63,auVar116);
                                    auVar166 = vandps_avx(auVar61,auVar116);
                                    auVar166 = vcmpps_avx(auVar165,auVar166,1);
                                    auVar166 = vblendvps_avx(auVar210,auVar201,auVar166);
                                    auVar154 = ZEXT3264(auVar166);
                                    auVar103 = vpackssdw_avx(auVar105._0_16_,auVar105._16_16_);
                                    fVar139 = auVar166._0_4_;
                                    fVar214 = auVar166._4_4_;
                                    fVar215 = auVar166._8_4_;
                                    fVar216 = auVar166._12_4_;
                                    fVar217 = auVar166._16_4_;
                                    fVar218 = auVar166._20_4_;
                                    fVar219 = auVar166._24_4_;
                                    fVar253 = auVar200._0_4_;
                                    fVar256 = auVar200._4_4_;
                                    fVar178 = auVar200._8_4_;
                                    fVar257 = auVar200._12_4_;
                                    fVar258 = auVar200._16_4_;
                                    fVar259 = auVar200._20_4_;
                                    fVar260 = auVar200._24_4_;
                                    fVar180 = auVar185._0_4_;
                                    fVar133 = auVar185._4_4_;
                                    fVar134 = auVar185._8_4_;
                                    fVar135 = auVar185._12_4_;
                                    fVar136 = auVar185._16_4_;
                                    fVar137 = auVar185._20_4_;
                                    fVar138 = auVar185._24_4_;
                                    fVar230 = fVar180 * (float)local_2ea0._4_4_ +
                                              fVar139 * fVar213 + fVar253 * fVar206;
                                    fVar232 = fVar133 * (float)local_2ea0._4_4_ +
                                              fVar214 * fVar213 + fVar256 * fVar206;
                                    fVar234 = fVar134 * (float)local_2ea0._4_4_ +
                                              fVar215 * fVar213 + fVar178 * fVar206;
                                    fVar236 = fVar135 * (float)local_2ea0._4_4_ +
                                              fVar216 * fVar213 + fVar257 * fVar206;
                                    fVar238 = fVar136 * (float)local_2ea0._4_4_ +
                                              fVar217 * fVar213 + fVar258 * fVar206;
                                    fVar240 = fVar137 * (float)local_2ea0._4_4_ +
                                              fVar218 * fVar213 + fVar259 * fVar206;
                                    fVar206 = fVar138 * (float)local_2ea0._4_4_ +
                                              fVar219 * fVar213 + fVar260 * fVar206;
                                    fVar213 = auVar105._28_4_ + 0.0 + 0.0;
                                    auVar191._0_4_ = fVar230 + fVar230;
                                    auVar191._4_4_ = fVar232 + fVar232;
                                    auVar191._8_4_ = fVar234 + fVar234;
                                    auVar191._12_4_ = fVar236 + fVar236;
                                    auVar191._16_4_ = fVar238 + fVar238;
                                    auVar191._20_4_ = fVar240 + fVar240;
                                    auVar191._24_4_ = fVar206 + fVar206;
                                    auVar191._28_4_ = fVar213 + fVar213;
                                    fVar230 = fVar180 * fVar157 +
                                              fVar139 * fVar156 + fVar253 * fVar155;
                                    fVar172 = fVar133 * fVar172 +
                                              fVar214 * fVar159 + fVar256 * fVar158;
                                    fVar173 = fVar134 * fVar175 +
                                              fVar215 * fVar174 + fVar178 * fVar173;
                                    fVar174 = fVar135 * fVar179 +
                                              fVar216 * fVar177 + fVar257 * fVar176;
                                    fVar175 = fVar136 * fVar10 + fVar217 * fVar9 + fVar258 * fVar8;
                                    fVar176 = fVar137 * fVar13 + fVar218 * fVar12 + fVar259 * fVar11
                                    ;
                                    fVar177 = fVar138 * fVar16 + fVar219 * fVar15 + fVar260 * fVar14
                                    ;
                                    fVar179 = auVar165._28_4_ + fVar213 + auVar165._28_4_;
                                    auVar105 = vrcpps_avx(auVar191);
                                    fVar206 = auVar105._0_4_;
                                    fVar213 = auVar105._4_4_;
                                    auVar65._4_4_ = auVar191._4_4_ * fVar213;
                                    auVar65._0_4_ = auVar191._0_4_ * fVar206;
                                    fVar155 = auVar105._8_4_;
                                    auVar65._8_4_ = auVar191._8_4_ * fVar155;
                                    fVar156 = auVar105._12_4_;
                                    auVar65._12_4_ = auVar191._12_4_ * fVar156;
                                    fVar157 = auVar105._16_4_;
                                    auVar65._16_4_ = auVar191._16_4_ * fVar157;
                                    fVar158 = auVar105._20_4_;
                                    auVar65._20_4_ = auVar191._20_4_ * fVar158;
                                    fVar159 = auVar105._24_4_;
                                    auVar65._24_4_ = auVar191._24_4_ * fVar159;
                                    auVar65._28_4_ = auVar125._28_4_;
                                    auVar117._8_4_ = 0x3f800000;
                                    auVar117._0_8_ = &DAT_3f8000003f800000;
                                    auVar117._12_4_ = 0x3f800000;
                                    auVar117._16_4_ = 0x3f800000;
                                    auVar117._20_4_ = 0x3f800000;
                                    auVar117._24_4_ = 0x3f800000;
                                    auVar117._28_4_ = 0x3f800000;
                                    auVar105 = vsubps_avx(auVar117,auVar65);
                                    auVar66._4_4_ =
                                         (fVar172 + fVar172) * (auVar105._4_4_ * fVar213 + fVar213);
                                    auVar66._0_4_ =
                                         (fVar230 + fVar230) * (auVar105._0_4_ * fVar206 + fVar206);
                                    auVar66._8_4_ =
                                         (fVar173 + fVar173) * (auVar105._8_4_ * fVar155 + fVar155);
                                    auVar66._12_4_ =
                                         (fVar174 + fVar174) * (auVar105._12_4_ * fVar156 + fVar156)
                                    ;
                                    auVar66._16_4_ =
                                         (fVar175 + fVar175) * (auVar105._16_4_ * fVar157 + fVar157)
                                    ;
                                    auVar66._20_4_ =
                                         (fVar176 + fVar176) * (auVar105._20_4_ * fVar158 + fVar158)
                                    ;
                                    auVar66._24_4_ =
                                         (fVar177 + fVar177) * (auVar105._24_4_ * fVar159 + fVar159)
                                    ;
                                    auVar66._28_4_ = fVar179 + fVar179;
                                    uVar91 = *(undefined4 *)(local_2db0 + lVar85 * 4 + 0x60);
                                    auVar228._4_4_ = uVar91;
                                    auVar228._0_4_ = uVar91;
                                    auVar228._8_4_ = uVar91;
                                    auVar228._12_4_ = uVar91;
                                    auVar228._16_4_ = uVar91;
                                    auVar228._20_4_ = uVar91;
                                    auVar228._24_4_ = uVar91;
                                    auVar228._28_4_ = uVar91;
                                    auVar105 = vcmpps_avx(auVar228,auVar66,2);
                                    uVar91 = *(undefined4 *)(local_2db0 + lVar85 * 4 + 0x100);
                                    auVar246._4_4_ = uVar91;
                                    auVar246._0_4_ = uVar91;
                                    auVar246._8_4_ = uVar91;
                                    auVar246._12_4_ = uVar91;
                                    auVar246._16_4_ = uVar91;
                                    auVar246._20_4_ = uVar91;
                                    auVar246._24_4_ = uVar91;
                                    auVar246._28_4_ = uVar91;
                                    auVar125 = vcmpps_avx(auVar66,auVar246,2);
                                    auVar105 = vandps_avx(auVar125,auVar105);
                                    auVar102 = vpackssdw_avx(auVar105._0_16_,auVar105._16_16_);
                                    auVar103 = vpand_avx(auVar102,auVar103);
                                    auVar102 = vpmovsxwd_avx(auVar103);
                                    auVar161 = vpshufd_avx(auVar103,0xee);
                                    auVar161 = vpmovsxwd_avx(auVar161);
                                    auVar229._16_16_ = auVar161;
                                    auVar229._0_16_ = auVar102;
                                    auVar166 = local_2d80;
                                    if ((((((((auVar229 >> 0x1f & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0 ||
                                             (auVar229 >> 0x3f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar229 >> 0x5f & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           SUB321(auVar229 >> 0x7f,0) != '\0') ||
                                          (auVar229 & (undefined1  [32])0x100000000) !=
                                          (undefined1  [32])0x0) ||
                                         SUB161(auVar161 >> 0x3f,0) != '\0') ||
                                        (auVar229 & (undefined1  [32])0x100000000) !=
                                        (undefined1  [32])0x0) || auVar161[0xf] < '\0') {
                                      auVar105 = vcmpps_avx(auVar191,_DAT_02020f00,4);
                                      auVar102 = vpackssdw_avx(auVar105._0_16_,auVar105._16_16_);
                                      auVar103 = vpand_avx(auVar103,auVar102);
                                      auVar102 = vpmovsxwd_avx(auVar103);
                                      auVar103 = vpunpckhwd_avx(auVar103,auVar103);
                                      auVar192._16_16_ = auVar103;
                                      auVar192._0_16_ = auVar102;
                                      if ((((((((auVar192 >> 0x1f & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0 ||
                                               (auVar192 >> 0x3f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar192 >> 0x5f & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             SUB321(auVar192 >> 0x7f,0) != '\0') ||
                                            (auVar192 & (undefined1  [32])0x100000000) !=
                                            (undefined1  [32])0x0) ||
                                           SUB161(auVar103 >> 0x3f,0) != '\0') ||
                                          (auVar192 & (undefined1  [32])0x100000000) !=
                                          (undefined1  [32])0x0) || auVar103[0xf] < '\0') {
                                        local_2c40 = local_2d80;
                                        local_2c20 = &local_2ee1;
                                        local_2c00 = auVar192;
                                        local_2ba0 = auVar66;
                                        auVar105 = vsubps_avx(local_2d80,local_2720);
                                        auVar105 = vblendvps_avx(local_2700,auVar105,local_2780);
                                        auVar125 = vsubps_avx(local_2d80,local_2700);
                                        auVar125 = vblendvps_avx(local_2720,auVar125,local_2780);
                                        uStack_2b64 = auVar185._28_4_;
                                        local_2b80[0] = (float)local_27a0._0_4_ * fVar180;
                                        local_2b80[1] = (float)local_27a0._4_4_ * fVar133;
                                        local_2b80[2] = fStack_2798 * fVar134;
                                        local_2b80[3] = fStack_2794 * fVar135;
                                        fStack_2b70 = fStack_2790 * fVar136;
                                        fStack_2b6c = fStack_278c * fVar137;
                                        fStack_2b68 = fStack_2788 * fVar138;
                                        local_2b60[0] = fVar253 * (float)local_27a0._0_4_;
                                        local_2b60[1] = fVar256 * (float)local_27a0._4_4_;
                                        local_2b60[2] = fVar178 * fStack_2798;
                                        local_2b60[3] = fVar257 * fStack_2794;
                                        fStack_2b50 = fVar258 * fStack_2790;
                                        fStack_2b4c = fVar259 * fStack_278c;
                                        fStack_2b48 = fVar260 * fStack_2788;
                                        uStack_2b44 = uStack_2b64;
                                        local_2b40[0] = (float)local_27a0._0_4_ * fVar139;
                                        local_2b40[1] = (float)local_27a0._4_4_ * fVar214;
                                        local_2b40[2] = fStack_2798 * fVar215;
                                        local_2b40[3] = fStack_2794 * fVar216;
                                        fStack_2b30 = fStack_2790 * fVar217;
                                        fStack_2b2c = fStack_278c * fVar218;
                                        fStack_2b28 = fStack_2788 * fVar219;
                                        uStack_2b24 = uStack_2b64;
                                        auVar124._0_4_ =
                                             (float)(int)(*(ushort *)(local_2d90 + 8 + local_2d98) -
                                                         1);
                                        auVar124._4_12_ = auVar202._4_12_;
                                        auVar103 = vrcpss_avx(auVar124,auVar124);
                                        auVar145._0_4_ =
                                             (float)(int)(*(ushort *)(local_2d90 + 10 + local_2d98)
                                                         - 1);
                                        auVar145._4_12_ = auVar202._4_12_;
                                        auVar102 = vrcpss_avx(auVar145,auVar145);
                                        auVar103 = ZEXT416((uint)(auVar103._0_4_ *
                                                                 (2.0 - auVar103._0_4_ *
                                                                        auVar124._0_4_)));
                                        auVar103 = vshufps_avx(auVar103,auVar103,0);
                                        local_2c80._0_4_ =
                                             (local_2d80._0_4_ * (float)local_2740._0_4_ +
                                             auVar105._0_4_) * auVar103._0_4_;
                                        local_2c80._4_4_ =
                                             (local_2d80._4_4_ * (float)local_2740._4_4_ +
                                             auVar105._4_4_) * auVar103._4_4_;
                                        fStack_2c78 = (local_2d80._8_4_ * fStack_2738 +
                                                      auVar105._8_4_) * auVar103._8_4_;
                                        fStack_2c64 = auVar103._12_4_;
                                        fStack_2c74 = (local_2d80._12_4_ * fStack_2734 +
                                                      auVar105._12_4_) * fStack_2c64;
                                        fStack_2c70 = (local_2d80._16_4_ * fStack_2730 +
                                                      auVar105._16_4_) * auVar103._0_4_;
                                        fStack_2c6c = (local_2d80._20_4_ * fStack_272c +
                                                      auVar105._20_4_) * auVar103._4_4_;
                                        fStack_2c68 = (local_2d80._24_4_ * fStack_2728 +
                                                      auVar105._24_4_) * auVar103._8_4_;
                                        auVar103 = ZEXT416((uint)(auVar102._0_4_ *
                                                                 (2.0 - auVar102._0_4_ *
                                                                        auVar145._0_4_)));
                                        auVar103 = vshufps_avx(auVar103,auVar103,0);
                                        fVar206 = (local_2d80._0_4_ * (float)local_2760._0_4_ +
                                                  auVar125._0_4_) * auVar103._0_4_;
                                        fVar213 = (local_2d80._4_4_ * (float)local_2760._4_4_ +
                                                  auVar125._4_4_) * auVar103._4_4_;
                                        local_2c60._4_4_ = fVar213;
                                        local_2c60._0_4_ = fVar206;
                                        fVar155 = (local_2d80._8_4_ * fStack_2758 + auVar125._8_4_)
                                                  * auVar103._8_4_;
                                        local_2c60._8_4_ = fVar155;
                                        fVar156 = (local_2d80._12_4_ * fStack_2754 + auVar125._12_4_
                                                  ) * auVar103._12_4_;
                                        local_2c60._12_4_ = fVar156;
                                        fVar157 = (local_2d80._16_4_ * fStack_2750 + auVar125._16_4_
                                                  ) * auVar103._0_4_;
                                        local_2c60._16_4_ = fVar157;
                                        fVar158 = (local_2d80._20_4_ * fStack_274c + auVar125._20_4_
                                                  ) * auVar103._4_4_;
                                        local_2c60._20_4_ = fVar158;
                                        fVar159 = (local_2d80._24_4_ * fStack_2748 + auVar125._24_4_
                                                  ) * auVar103._8_4_;
                                        local_2c60._24_4_ = fVar159;
                                        local_2c60._28_4_ = auVar103._12_4_;
                                        auVar154 = ZEXT3264(local_2c60);
                                        pGVar95 = (local_2d88->geometries).items[local_2da0].ptr;
                                        if ((pGVar95->mask &
                                            *(uint *)(local_2db0 + lVar85 * 4 + 0x120)) != 0) {
                                          if ((local_2e50->args->filter != (RTCFilterFunctionN)0x0)
                                             || (pGVar95->occlusionFilterN !=
                                                 (RTCFilterFunctionN)0x0)) {
                                            auVar105 = vrcpps_avx(local_2d80);
                                            fVar172 = auVar105._0_4_;
                                            auVar118._0_4_ = local_2d80._0_4_ * fVar172;
                                            fVar173 = auVar105._4_4_;
                                            auVar118._4_4_ = local_2d80._4_4_ * fVar173;
                                            fVar174 = auVar105._8_4_;
                                            auVar118._8_4_ = local_2d80._8_4_ * fVar174;
                                            fVar175 = auVar105._12_4_;
                                            auVar118._12_4_ = local_2d80._12_4_ * fVar175;
                                            fVar176 = auVar105._16_4_;
                                            auVar118._16_4_ = local_2d80._16_4_ * fVar176;
                                            fVar177 = auVar105._20_4_;
                                            auVar118._20_4_ = local_2d80._20_4_ * fVar177;
                                            fVar179 = auVar105._24_4_;
                                            auVar118._24_4_ = local_2d80._24_4_ * fVar179;
                                            auVar118._28_4_ = 0;
                                            auVar193._8_4_ = 0x3f800000;
                                            auVar193._0_8_ = &DAT_3f8000003f800000;
                                            auVar193._12_4_ = 0x3f800000;
                                            auVar193._16_4_ = 0x3f800000;
                                            auVar193._20_4_ = 0x3f800000;
                                            auVar193._24_4_ = 0x3f800000;
                                            auVar193._28_4_ = 0x3f800000;
                                            auVar125 = vsubps_avx(auVar193,auVar118);
                                            auVar119._0_4_ = fVar172 + fVar172 * auVar125._0_4_;
                                            auVar119._4_4_ = fVar173 + fVar173 * auVar125._4_4_;
                                            auVar119._8_4_ = fVar174 + fVar174 * auVar125._8_4_;
                                            auVar119._12_4_ = fVar175 + fVar175 * auVar125._12_4_;
                                            auVar119._16_4_ = fVar176 + fVar176 * auVar125._16_4_;
                                            auVar119._20_4_ = fVar177 + fVar177 * auVar125._20_4_;
                                            auVar119._24_4_ = fVar179 + fVar179 * auVar125._24_4_;
                                            auVar119._28_4_ = auVar105._28_4_ + auVar125._28_4_;
                                            auVar171._8_4_ = 0x219392ef;
                                            auVar171._0_8_ = 0x219392ef219392ef;
                                            auVar171._12_4_ = 0x219392ef;
                                            auVar171._16_4_ = 0x219392ef;
                                            auVar171._20_4_ = 0x219392ef;
                                            auVar171._24_4_ = 0x219392ef;
                                            auVar171._28_4_ = 0x219392ef;
                                            auVar105 = vcmpps_avx(local_27c0,auVar171,5);
                                            auVar105 = vandps_avx(auVar105,auVar119);
                                            auVar67._4_4_ = (float)local_2c80._4_4_ * auVar105._4_4_
                                            ;
                                            auVar67._0_4_ = (float)local_2c80._0_4_ * auVar105._0_4_
                                            ;
                                            auVar67._8_4_ = fStack_2c78 * auVar105._8_4_;
                                            auVar67._12_4_ = fStack_2c74 * auVar105._12_4_;
                                            auVar67._16_4_ = fStack_2c70 * auVar105._16_4_;
                                            auVar67._20_4_ = fStack_2c6c * auVar105._20_4_;
                                            auVar67._24_4_ = fStack_2c68 * auVar105._24_4_;
                                            auVar67._28_4_ = fStack_2c64;
                                            local_2be0 = vminps_avx(auVar67,auVar193);
                                            auVar68._4_4_ = fVar213 * auVar105._4_4_;
                                            auVar68._0_4_ = fVar206 * auVar105._0_4_;
                                            auVar68._8_4_ = fVar155 * auVar105._8_4_;
                                            auVar68._12_4_ = fVar156 * auVar105._12_4_;
                                            auVar68._16_4_ = fVar157 * auVar105._16_4_;
                                            auVar68._20_4_ = fVar158 * auVar105._20_4_;
                                            auVar68._24_4_ = fVar159 * auVar105._24_4_;
                                            auVar68._28_4_ = auVar105._28_4_;
                                            local_2bc0 = vminps_avx(auVar68,auVar193);
                                            iVar88 = vmovmskps_avx(auVar192);
                                            uVar90 = CONCAT44((int)((ulong)local_2d98 >> 0x20),
                                                              iVar88);
                                            uVar84 = 0;
                                            if (uVar90 != 0) {
                                              for (; (uVar90 >> uVar84 & 1) == 0;
                                                  uVar84 = uVar84 + 1) {
                                              }
                                            }
                                            local_2d80[0] = iVar88 != 0;
                                            if (iVar88 != 0) {
                                              uVar86 = 1 << ((byte)lVar85 & 0x1f);
                                              local_2e80._0_8_ = uVar90;
                                              lVar82 = (long)((int)uVar86 >> 4) * 0x10;
                                              local_2cc0._16_8_ =
                                                   *(undefined8 *)(mm_lookupmask_ps + lVar82);
                                              local_2cc0._0_16_ =
                                                   *(undefined1 (*) [16])
                                                    (mm_lookupmask_ps + ((uVar86 & 0xf) << 4));
                                              local_2cc0._24_8_ =
                                                   *(undefined8 *)(mm_lookupmask_ps + lVar82 + 8);
                                              local_2ce0._0_8_ = pGVar95;
                                              do {
                                                uVar91 = *(undefined4 *)(ray + lVar85 * 4 + 0x100);
                                                local_2900 = *(undefined4 *)
                                                              (local_2be0 + uVar84 * 4);
                                                local_28e0 = *(undefined4 *)
                                                              (local_2bc0 + uVar84 * 4);
                                                *(undefined4 *)(ray + lVar85 * 4 + 0x100) =
                                                     *(undefined4 *)(local_2ba0 + uVar84 * 4);
                                                fVar206 = local_2b80[uVar84];
                                                auVar146._4_4_ = fVar206;
                                                auVar146._0_4_ = fVar206;
                                                auVar146._8_4_ = fVar206;
                                                auVar146._12_4_ = fVar206;
                                                register0x00001290 = fVar206;
                                                _local_2960 = auVar146;
                                                register0x00001294 = fVar206;
                                                register0x00001298 = fVar206;
                                                register0x0000129c = fVar206;
                                                auVar154 = ZEXT3264(_local_2960);
                                                fVar206 = local_2b60[uVar84];
                                                local_2940._4_4_ = fVar206;
                                                local_2940._0_4_ = fVar206;
                                                local_2940._8_4_ = fVar206;
                                                local_2940._12_4_ = fVar206;
                                                local_2940._16_4_ = fVar206;
                                                local_2940._20_4_ = fVar206;
                                                local_2940._24_4_ = fVar206;
                                                local_2940._28_4_ = fVar206;
                                                fVar206 = local_2b40[uVar84];
                                                local_2920._4_4_ = fVar206;
                                                local_2920._0_4_ = fVar206;
                                                local_2920._8_4_ = fVar206;
                                                local_2920._12_4_ = fVar206;
                                                local_2920._16_4_ = fVar206;
                                                local_2920._20_4_ = fVar206;
                                                local_2920._24_4_ = fVar206;
                                                local_2920._28_4_ = fVar206;
                                                local_2d30.context = context->user;
                                                uStack_28fc = local_2900;
                                                uStack_28f8 = local_2900;
                                                uStack_28f4 = local_2900;
                                                uStack_28f0 = local_2900;
                                                uStack_28ec = local_2900;
                                                uStack_28e8 = local_2900;
                                                uStack_28e4 = local_2900;
                                                uStack_28dc = local_28e0;
                                                uStack_28d8 = local_28e0;
                                                uStack_28d4 = local_28e0;
                                                uStack_28d0 = local_28e0;
                                                uStack_28cc = local_28e0;
                                                uStack_28c8 = local_28e0;
                                                uStack_28c4 = local_28e0;
                                                local_28c0 = local_2820._0_8_;
                                                uStack_28b8 = local_2820._8_8_;
                                                uStack_28b0 = local_2820._16_8_;
                                                uStack_28a8 = local_2820._24_8_;
                                                local_28a0 = local_2800;
                                                vcmpps_avx(local_2800,local_2800,0xf);
                                                local_2880._4_4_ = (local_2d30.context)->instID[0];
                                                local_2880._0_4_ = local_2880._4_4_;
                                                local_2880._8_4_ = local_2880._4_4_;
                                                local_2880._12_4_ = local_2880._4_4_;
                                                local_2880._16_4_ = local_2880._4_4_;
                                                local_2880._20_4_ = local_2880._4_4_;
                                                local_2880._24_4_ = local_2880._4_4_;
                                                local_2880._28_4_ = local_2880._4_4_;
                                                local_2860._4_4_ =
                                                     (local_2d30.context)->instPrimID[0];
                                                local_2860._0_4_ = local_2860._4_4_;
                                                local_2860._8_4_ = local_2860._4_4_;
                                                local_2860._12_4_ = local_2860._4_4_;
                                                local_2860._16_4_ = local_2860._4_4_;
                                                local_2860._20_4_ = local_2860._4_4_;
                                                local_2860._24_4_ = local_2860._4_4_;
                                                local_2860._28_4_ = local_2860._4_4_;
                                                local_2d60 = local_2cc0._0_8_;
                                                uStack_2d58 = local_2cc0._8_8_;
                                                uStack_2d50 = local_2cc0._16_8_;
                                                uStack_2d48 = local_2cc0._24_8_;
                                                local_2d30.valid = (int *)&local_2d60;
                                                local_2d30.geometryUserPtr = pGVar95->userPtr;
                                                local_2d30.ray = (RTCRayN *)ray;
                                                local_2d30.hit = (RTCHitN *)local_2960;
                                                local_2d30.N = 8;
                                                local_2ea0 = (undefined1  [8])uVar84;
                                                if (pGVar95->occlusionFilterN !=
                                                    (RTCFilterFunctionN)0x0) {
                                                  local_2e80._0_8_ = uVar90;
                                                  local_2e40._0_4_ = uVar91;
                                                  auVar154 = ZEXT1664(auVar146);
                                                  (*pGVar95->occlusionFilterN)(&local_2d30);
                                                  uVar90 = local_2e80._0_8_;
                                                  uVar81 = local_2e20._0_8_;
                                                  puVar92 = local_2ed0;
                                                  pauVar93 = local_2ed8;
                                                  uVar94 = local_2ee0;
                                                  lVar85 = local_2eb0;
                                                  pGVar95 = (Geometry *)local_2ce0._0_8_;
                                                  uVar91 = local_2e40._0_4_;
                                                }
                                                auVar69._8_8_ = uStack_2d58;
                                                auVar69._0_8_ = local_2d60;
                                                auVar103 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar69);
                                                auVar71._8_8_ = uStack_2d48;
                                                auVar71._0_8_ = uStack_2d50;
                                                auVar102 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar71);
                                                auVar120._16_16_ = auVar102;
                                                auVar120._0_16_ = auVar103;
                                                auVar105 = vcmpps_avx(ZEXT1632(auVar102),
                                                                      ZEXT1632(auVar102),0xf);
                                                auVar125 = auVar105 & ~auVar120;
                                                if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1)
                                                          == (undefined1  [32])0x0 &&
                                                         (auVar125 >> 0x3f & (undefined1  [32])0x1)
                                                         == (undefined1  [32])0x0) &&
                                                        (auVar125 >> 0x5f & (undefined1  [32])0x1)
                                                        == (undefined1  [32])0x0) &&
                                                       SUB321(auVar125 >> 0x7f,0) == '\0') &&
                                                      (auVar125 & (undefined1  [32])0x100000000) ==
                                                      (undefined1  [32])0x0) &&
                                                     SUB321(auVar125 >> 0xbf,0) == '\0') &&
                                                    (auVar125 & (undefined1  [32])0x100000000) ==
                                                    (undefined1  [32])0x0) && -1 < auVar125[0x1f]) {
                                                  auVar121._0_4_ = auVar103._0_4_ ^ auVar105._0_4_;
                                                  auVar121._4_4_ = auVar103._4_4_ ^ auVar105._4_4_;
                                                  auVar121._8_4_ = auVar103._8_4_ ^ auVar105._8_4_;
                                                  auVar121._12_4_ =
                                                       auVar103._12_4_ ^ auVar105._12_4_;
                                                  auVar121._16_4_ = auVar102._0_4_ ^ auVar105._16_4_
                                                  ;
                                                  auVar121._20_4_ = auVar102._4_4_ ^ auVar105._20_4_
                                                  ;
                                                  auVar121._24_4_ = auVar102._8_4_ ^ auVar105._24_4_
                                                  ;
                                                  auVar121._28_4_ =
                                                       auVar102._12_4_ ^ auVar105._28_4_;
                                                }
                                                else {
                                                  p_Var7 = context->args->filter;
                                                  if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                                     (((context->args->flags &
                                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                                      (((pGVar95->field_8).field_0x2 & 0x40) != 0)))
                                                     ) {
                                                    local_2e80._0_8_ = uVar90;
                                                    local_2e40._0_4_ = uVar91;
                                                    (*p_Var7)(&local_2d30);
                                                    uVar90 = local_2e80._0_8_;
                                                    uVar81 = local_2e20._0_8_;
                                                    puVar92 = local_2ed0;
                                                    pauVar93 = local_2ed8;
                                                    uVar94 = local_2ee0;
                                                    lVar85 = local_2eb0;
                                                    pGVar95 = (Geometry *)local_2ce0._0_8_;
                                                    uVar91 = local_2e40._0_4_;
                                                  }
                                                  auVar70._8_8_ = uStack_2d58;
                                                  auVar70._0_8_ = local_2d60;
                                                  auVar103 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar70
                                                                         );
                                                  auVar72._8_8_ = uStack_2d48;
                                                  auVar72._0_8_ = uStack_2d50;
                                                  auVar102 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar72
                                                                         );
                                                  auVar130._16_16_ = auVar102;
                                                  auVar130._0_16_ = auVar103;
                                                  auVar105 = vcmpps_avx(ZEXT1632(auVar103),
                                                                        ZEXT1632(auVar103),0xf);
                                                  auVar121._0_4_ = auVar103._0_4_ ^ auVar105._0_4_;
                                                  auVar121._4_4_ = auVar103._4_4_ ^ auVar105._4_4_;
                                                  auVar121._8_4_ = auVar103._8_4_ ^ auVar105._8_4_;
                                                  auVar121._12_4_ =
                                                       auVar103._12_4_ ^ auVar105._12_4_;
                                                  auVar121._16_4_ = auVar102._0_4_ ^ auVar105._16_4_
                                                  ;
                                                  auVar121._20_4_ = auVar102._4_4_ ^ auVar105._20_4_
                                                  ;
                                                  auVar121._24_4_ = auVar102._8_4_ ^ auVar105._24_4_
                                                  ;
                                                  auVar121._28_4_ =
                                                       auVar102._12_4_ ^ auVar105._28_4_;
                                                  auVar151._8_4_ = 0xff800000;
                                                  auVar151._0_8_ = 0xff800000ff800000;
                                                  auVar151._12_4_ = 0xff800000;
                                                  auVar151._16_4_ = 0xff800000;
                                                  auVar151._20_4_ = 0xff800000;
                                                  auVar151._24_4_ = 0xff800000;
                                                  auVar151._28_4_ = 0xff800000;
                                                  auVar154 = ZEXT3264(auVar151);
                                                  auVar105 = vblendvps_avx(auVar151,*(undefined1
                                                                                      (*) [32])
                                                                                     (local_2d30.ray
                                                                                     + 0x100),
                                                                           auVar130);
                                                  *(undefined1 (*) [32])(local_2d30.ray + 0x100) =
                                                       auVar105;
                                                }
                                                if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1)
                                                          != (undefined1  [32])0x0 ||
                                                         (auVar121 >> 0x3f & (undefined1  [32])0x1)
                                                         != (undefined1  [32])0x0) ||
                                                        (auVar121 >> 0x5f & (undefined1  [32])0x1)
                                                        != (undefined1  [32])0x0) ||
                                                       SUB321(auVar121 >> 0x7f,0) != '\0') ||
                                                      (auVar121 & (undefined1  [32])0x100000000) !=
                                                      (undefined1  [32])0x0) ||
                                                     SUB321(auVar121 >> 0xbf,0) != '\0') ||
                                                    (auVar121 & (undefined1  [32])0x100000000) !=
                                                    (undefined1  [32])0x0) || auVar121[0x1f] < '\0')
                                                break;
                                                *(undefined4 *)(local_2e58 + lVar85 * 4) = uVar91;
                                                uVar90 = uVar90 ^ 1L << ((ulong)local_2ea0 & 0x3f);
                                                uVar84 = 0;
                                                if (uVar90 != 0) {
                                                  for (; (uVar90 >> uVar84 & 1) == 0;
                                                      uVar84 = uVar84 + 1) {
                                                  }
                                                }
                                                local_2d80[0] = uVar90 != 0;
                                              } while (uVar90 != 0);
                                            }
                                            auVar166 = local_2d80;
                                            if ((local_2d80 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) goto LAB_003b4761;
                                          }
                                          *(undefined4 *)(local_2c80 + lVar85 * 4 + -0x20) = 0;
                                          auVar166 = local_2d80;
                                        }
                                      }
                                    }
                                  }
LAB_003b4761:
                                  local_2d80 = auVar166;
                                  uVar81 = uVar81 & uVar81 - 1;
                                  pRVar96 = ray;
                                  pRVar98 = context;
                                  uVar84 = uVar79;
                                } while (uVar81 != 0);
                              }
                              auVar105 = local_2d00 & local_2ca0;
                              bVar100 = (((((((auVar105 >> 0x1f & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0 &&
                                             (auVar105 >> 0x3f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar105 >> 0x5f & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           SUB321(auVar105 >> 0x7f,0) == '\0') &&
                                          (auVar105 & (undefined1  [32])0x100000000) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar105 >> 0xbf,0) == '\0') &&
                                        (auVar105 & (undefined1  [32])0x100000000) ==
                                        (undefined1  [32])0x0) && -1 < auVar105[0x1f];
                              local_2d00 = vandps_avx(local_2ca0,local_2d00);
                            }
                          } while ((!bVar100) && (uVar81 = local_2db8 & local_2db8 - 1, uVar81 != 0)
                                  );
                        }
                        auVar103 = auVar154._0_16_;
                        lVar85 = local_2dc0 + 1;
                      } while (lVar85 != local_2dc8);
                      auVar122._0_8_ = local_2d00._0_8_ ^ 0xffffffffffffffff;
                      auVar122._8_4_ = local_2d00._8_4_ ^ 0xffffffff;
                      auVar122._12_4_ = local_2d00._12_4_ ^ 0xffffffff;
                      auVar122._16_4_ = local_2d00._16_4_ ^ 0xffffffff;
                      auVar122._20_4_ = local_2d00._20_4_ ^ 0xffffffff;
                      auVar122._24_4_ = local_2d00._24_4_ ^ 0xffffffff;
                      auVar122._28_4_ = local_2d00._28_4_ ^ 0xffffffff;
                    }
                    auVar105 = local_2980;
                    _local_2e00 = vorps_avx(auVar122,_local_2e00);
                    auVar103 = vpcmpeqd_avx(auVar103,auVar103);
                    auVar102 = vpcmpgtd_avx(local_2e00._16_16_,auVar103);
                    auVar103 = vpcmpgtd_avx(local_2e00._0_16_,auVar103);
                    auVar103 = vpor_avx(auVar103,auVar102);
                    auVar125 = ZEXT1632(auVar103);
                    if ((((auVar103 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar103 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar103 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar103[0xf]) {
                      iVar88 = 3;
                    }
                    else {
                      auVar152._8_4_ = 0xff800000;
                      auVar152._0_8_ = 0xff800000ff800000;
                      auVar152._12_4_ = 0xff800000;
                      auVar152._16_4_ = 0xff800000;
                      auVar152._20_4_ = 0xff800000;
                      auVar152._24_4_ = 0xff800000;
                      auVar152._28_4_ = 0xff800000;
                      local_2980 = vblendvps_avx(local_2980,auVar152,_local_2e00);
                      iVar88 = 0;
                      auVar125 = auVar105;
                    }
                    auVar105 = vcmpps_avx(auVar125,auVar125,0xf);
                    auVar132 = ZEXT3264(auVar105);
                    break;
                  }
                  goto LAB_003b4bfe;
                }
                uVar81 = local_2ee0 & 0xfffffffffffffff0;
                local_2e20 = vcmpps_avx(local_2980,auVar154._0_32_,6);
                auVar154 = ZEXT3264(CONCAT428(0x7f800000,
                                              CONCAT424(0x7f800000,
                                                        CONCAT420(0x7f800000,
                                                                  CONCAT416(0x7f800000,
                                                                            CONCAT412(0x7f800000,
                                                                                      CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                local_2ee0 = 8;
                uVar94 = 0;
                do {
                  uVar84 = *(ulong *)(uVar81 + uVar94 * 8);
                  if (uVar84 != 8) {
                    fVar206 = *(float *)(uVar81 + 0x80 + uVar94 * 4);
                    fVar213 = *(float *)(uVar81 + 0x20 + uVar94 * 4);
                    auVar105 = *(undefined1 (*) [32])(ray + 0xe0);
                    fVar157 = auVar105._0_4_;
                    fVar158 = auVar105._4_4_;
                    fVar159 = auVar105._8_4_;
                    fVar172 = auVar105._12_4_;
                    fVar173 = auVar105._16_4_;
                    fVar174 = auVar105._20_4_;
                    fVar175 = auVar105._24_4_;
                    fVar155 = *(float *)(uVar81 + 0xa0 + uVar94 * 4);
                    auVar147._0_4_ = fVar157 * fVar206 + fVar213;
                    auVar147._4_4_ = fVar158 * fVar206 + fVar213;
                    auVar147._8_4_ = fVar159 * fVar206 + fVar213;
                    auVar147._12_4_ = fVar172 * fVar206 + fVar213;
                    auVar147._16_4_ = fVar173 * fVar206 + fVar213;
                    auVar147._20_4_ = fVar174 * fVar206 + fVar213;
                    auVar147._24_4_ = fVar175 * fVar206 + fVar213;
                    auVar147._28_4_ = fVar206 + fVar213;
                    fVar206 = *(float *)(uVar81 + 0x40 + uVar94 * 4);
                    fVar213 = *(float *)(uVar81 + 0xc0 + uVar94 * 4);
                    fVar156 = *(float *)(uVar81 + 0x60 + uVar94 * 4);
                    auVar167._0_4_ = fVar157 * fVar155 + fVar206;
                    auVar167._4_4_ = fVar158 * fVar155 + fVar206;
                    auVar167._8_4_ = fVar159 * fVar155 + fVar206;
                    auVar167._12_4_ = fVar172 * fVar155 + fVar206;
                    auVar167._16_4_ = fVar173 * fVar155 + fVar206;
                    auVar167._20_4_ = fVar174 * fVar155 + fVar206;
                    auVar167._24_4_ = fVar175 * fVar155 + fVar206;
                    auVar167._28_4_ = fVar155 + fVar206;
                    fVar206 = *(float *)(uVar81 + 0x90 + uVar94 * 4);
                    auVar186._0_4_ = fVar157 * fVar213 + fVar156;
                    auVar186._4_4_ = fVar158 * fVar213 + fVar156;
                    auVar186._8_4_ = fVar159 * fVar213 + fVar156;
                    auVar186._12_4_ = fVar172 * fVar213 + fVar156;
                    auVar186._16_4_ = fVar173 * fVar213 + fVar156;
                    auVar186._20_4_ = fVar174 * fVar213 + fVar156;
                    auVar186._24_4_ = fVar175 * fVar213 + fVar156;
                    auVar186._28_4_ = fVar155 + fVar156;
                    fVar213 = *(float *)(uVar81 + 0x30 + uVar94 * 4);
                    fVar155 = *(float *)(uVar81 + 0xb0 + uVar94 * 4);
                    fVar156 = *(float *)(uVar81 + 0x50 + uVar94 * 4);
                    auVar203._0_4_ = fVar157 * fVar206 + fVar213;
                    auVar203._4_4_ = fVar158 * fVar206 + fVar213;
                    auVar203._8_4_ = fVar159 * fVar206 + fVar213;
                    auVar203._12_4_ = fVar172 * fVar206 + fVar213;
                    auVar203._16_4_ = fVar173 * fVar206 + fVar213;
                    auVar203._20_4_ = fVar174 * fVar206 + fVar213;
                    auVar203._24_4_ = fVar175 * fVar206 + fVar213;
                    auVar203._28_4_ = fVar206 + fVar213;
                    fVar206 = *(float *)(uVar81 + 0xd0 + uVar94 * 4);
                    auVar211._0_4_ = fVar156 + fVar157 * fVar155;
                    auVar211._4_4_ = fVar156 + fVar158 * fVar155;
                    auVar211._8_4_ = fVar156 + fVar159 * fVar155;
                    auVar211._12_4_ = fVar156 + fVar172 * fVar155;
                    auVar211._16_4_ = fVar156 + fVar173 * fVar155;
                    auVar211._20_4_ = fVar156 + fVar174 * fVar155;
                    auVar211._24_4_ = fVar156 + fVar175 * fVar155;
                    auVar211._28_4_ = fVar156 + fVar213;
                    fVar213 = *(float *)(uVar81 + 0x70 + uVar94 * 4);
                    auVar226._0_4_ = fVar213 + fVar157 * fVar206;
                    auVar226._4_4_ = fVar213 + fVar158 * fVar206;
                    auVar226._8_4_ = fVar213 + fVar159 * fVar206;
                    auVar226._12_4_ = fVar213 + fVar172 * fVar206;
                    auVar226._16_4_ = fVar213 + fVar173 * fVar206;
                    auVar226._20_4_ = fVar213 + fVar174 * fVar206;
                    auVar226._24_4_ = fVar213 + fVar175 * fVar206;
                    auVar226._28_4_ = fVar213 + fVar206;
                    auVar73._8_8_ = local_2b20._8_8_;
                    auVar73._0_8_ = local_2b20._0_8_;
                    auVar73._16_8_ = local_2b20._16_8_;
                    auVar73._24_8_ = local_2b20._24_8_;
                    auVar75._8_8_ = local_2b20._40_8_;
                    auVar75._0_8_ = local_2b20._32_8_;
                    auVar75._16_8_ = local_2b20._48_8_;
                    auVar75._24_8_ = local_2b20._56_8_;
                    auVar77._8_8_ = local_2b20._72_8_;
                    auVar77._0_8_ = local_2b20._64_8_;
                    auVar77._16_8_ = local_2b20._80_8_;
                    auVar77._24_8_ = local_2b20._88_8_;
                    auVar125 = vsubps_avx(auVar147,auVar73);
                    auVar140._0_4_ = (float)local_2a60._0_4_ * auVar125._0_4_;
                    auVar140._4_4_ = (float)local_2a60._4_4_ * auVar125._4_4_;
                    auVar140._8_4_ = fStack_2a58 * auVar125._8_4_;
                    auVar140._12_4_ = fStack_2a54 * auVar125._12_4_;
                    auVar17._16_4_ = fStack_2a50 * auVar125._16_4_;
                    auVar17._0_16_ = auVar140;
                    auVar17._20_4_ = fStack_2a4c * auVar125._20_4_;
                    auVar17._24_4_ = fStack_2a48 * auVar125._24_4_;
                    auVar17._28_4_ = auVar125._28_4_;
                    auVar125 = vsubps_avx(auVar167,auVar75);
                    auVar160._0_4_ = (float)local_2a40._0_4_ * auVar125._0_4_;
                    auVar160._4_4_ = (float)local_2a40._4_4_ * auVar125._4_4_;
                    auVar160._8_4_ = fStack_2a38 * auVar125._8_4_;
                    auVar160._12_4_ = fStack_2a34 * auVar125._12_4_;
                    auVar18._16_4_ = fStack_2a30 * auVar125._16_4_;
                    auVar18._0_16_ = auVar160;
                    auVar18._20_4_ = fStack_2a2c * auVar125._20_4_;
                    auVar18._24_4_ = fStack_2a28 * auVar125._24_4_;
                    auVar18._28_4_ = auVar125._28_4_;
                    auVar125 = vsubps_avx(auVar186,auVar77);
                    auVar181._0_4_ = (float)local_2a20._0_4_ * auVar125._0_4_;
                    auVar181._4_4_ = (float)local_2a20._4_4_ * auVar125._4_4_;
                    auVar181._8_4_ = fStack_2a18 * auVar125._8_4_;
                    auVar181._12_4_ = fStack_2a14 * auVar125._12_4_;
                    auVar19._16_4_ = fStack_2a10 * auVar125._16_4_;
                    auVar19._0_16_ = auVar181;
                    auVar19._20_4_ = fStack_2a0c * auVar125._20_4_;
                    auVar19._24_4_ = fStack_2a08 * auVar125._24_4_;
                    auVar19._28_4_ = auVar125._28_4_;
                    auVar125 = vsubps_avx(auVar203,auVar73);
                    auVar196._0_4_ = (float)local_2a60._0_4_ * auVar125._0_4_;
                    auVar196._4_4_ = (float)local_2a60._4_4_ * auVar125._4_4_;
                    auVar196._8_4_ = fStack_2a58 * auVar125._8_4_;
                    auVar196._12_4_ = fStack_2a54 * auVar125._12_4_;
                    auVar20._16_4_ = fStack_2a50 * auVar125._16_4_;
                    auVar20._0_16_ = auVar196;
                    auVar20._20_4_ = fStack_2a4c * auVar125._20_4_;
                    auVar20._24_4_ = fStack_2a48 * auVar125._24_4_;
                    auVar20._28_4_ = auVar125._28_4_;
                    auVar125 = vsubps_avx(auVar211,auVar75);
                    auVar207._0_4_ = (float)local_2a40._0_4_ * auVar125._0_4_;
                    auVar207._4_4_ = (float)local_2a40._4_4_ * auVar125._4_4_;
                    auVar207._8_4_ = fStack_2a38 * auVar125._8_4_;
                    auVar207._12_4_ = fStack_2a34 * auVar125._12_4_;
                    auVar21._16_4_ = fStack_2a30 * auVar125._16_4_;
                    auVar21._0_16_ = auVar207;
                    auVar21._20_4_ = fStack_2a2c * auVar125._20_4_;
                    auVar21._24_4_ = fStack_2a28 * auVar125._24_4_;
                    auVar21._28_4_ = auVar125._28_4_;
                    auVar125 = vsubps_avx(auVar226,auVar77);
                    auVar221._0_4_ = (float)local_2a20._0_4_ * auVar125._0_4_;
                    auVar221._4_4_ = (float)local_2a20._4_4_ * auVar125._4_4_;
                    auVar221._8_4_ = fStack_2a18 * auVar125._8_4_;
                    auVar221._12_4_ = fStack_2a14 * auVar125._12_4_;
                    auVar22._16_4_ = fStack_2a10 * auVar125._16_4_;
                    auVar22._0_16_ = auVar221;
                    auVar22._20_4_ = fStack_2a0c * auVar125._20_4_;
                    auVar22._24_4_ = fStack_2a08 * auVar125._24_4_;
                    auVar22._28_4_ = auVar125._28_4_;
                    auVar103 = vpminsd_avx(auVar17._16_16_,auVar20._16_16_);
                    auVar102 = vpminsd_avx(auVar140,auVar196);
                    auVar161 = vpminsd_avx(auVar18._16_16_,auVar21._16_16_);
                    auVar103 = vpmaxsd_avx(auVar103,auVar161);
                    auVar161 = vpminsd_avx(auVar160,auVar207);
                    auVar102 = vpmaxsd_avx(auVar102,auVar161);
                    auVar161 = vpminsd_avx(auVar181,auVar221);
                    auVar102 = vpmaxsd_avx(auVar102,auVar161);
                    auVar161 = vpminsd_avx(auVar19._16_16_,auVar22._16_16_);
                    auVar103 = vpmaxsd_avx(auVar103,auVar161);
                    auVar161 = vpmaxsd_avx(auVar17._16_16_,auVar20._16_16_);
                    auVar142 = vpmaxsd_avx(auVar140,auVar196);
                    auVar143 = vpmaxsd_avx(auVar18._16_16_,auVar21._16_16_);
                    auVar143 = vpminsd_avx(auVar161,auVar143);
                    auVar161 = vpmaxsd_avx(auVar160,auVar207);
                    auVar142 = vpminsd_avx(auVar142,auVar161);
                    auVar161 = vpmaxsd_avx(auVar181,auVar221);
                    auVar161 = vpminsd_avx(auVar142,auVar161);
                    auVar141._0_4_ = auVar102._0_4_ * 0.99999964;
                    auVar141._4_4_ = auVar102._4_4_ * 0.99999964;
                    auVar141._8_4_ = auVar102._8_4_ * 0.99999964;
                    auVar141._12_4_ = auVar102._12_4_ * 0.99999964;
                    auVar23._16_4_ = auVar103._0_4_ * 0.99999964;
                    auVar23._0_16_ = auVar141;
                    auVar23._20_4_ = auVar103._4_4_ * 0.99999964;
                    auVar23._24_4_ = auVar103._8_4_ * 0.99999964;
                    auVar23._28_4_ = 0x3f7ffffa;
                    auVar103 = vpmaxsd_avx(auVar19._16_16_,auVar22._16_16_);
                    auVar103 = vpminsd_avx(auVar143,auVar103);
                    auVar101._0_4_ = auVar161._0_4_ * 1.0000004;
                    auVar101._4_4_ = auVar161._4_4_ * 1.0000004;
                    auVar101._8_4_ = auVar161._8_4_ * 1.0000004;
                    auVar101._12_4_ = auVar161._12_4_ * 1.0000004;
                    auVar24._16_4_ = auVar103._0_4_ * 1.0000004;
                    auVar24._0_16_ = auVar101;
                    auVar24._20_4_ = auVar103._4_4_ * 1.0000004;
                    auVar24._24_4_ = auVar103._8_4_ * 1.0000004;
                    auVar24._28_4_ = auVar103._12_4_;
                    auVar103 = vpmaxsd_avx(auVar141,local_29a0._0_16_);
                    auVar102 = vpmaxsd_avx(auVar23._16_16_,local_29a0._16_16_);
                    auVar161 = vpminsd_avx(auVar101,local_2980._0_16_);
                    auVar142 = vpminsd_avx(auVar24._16_16_,local_2980._16_16_);
                    auVar168._16_16_ = auVar102;
                    auVar168._0_16_ = auVar103;
                    auVar106._16_16_ = auVar142;
                    auVar106._0_16_ = auVar161;
                    auVar125 = vcmpps_avx(auVar168,auVar106,2);
                    if ((uVar86 & 7) == 6) {
                      uVar91 = *(undefined4 *)(uVar81 + 0xe0 + uVar94 * 4);
                      auVar109._4_4_ = uVar91;
                      auVar109._0_4_ = uVar91;
                      auVar109._8_4_ = uVar91;
                      auVar109._12_4_ = uVar91;
                      auVar109._16_4_ = uVar91;
                      auVar109._20_4_ = uVar91;
                      auVar109._24_4_ = uVar91;
                      auVar109._28_4_ = uVar91;
                      auVar165 = vcmpps_avx(auVar109,auVar105,2);
                      uVar91 = *(undefined4 *)(uVar81 + 0xf0 + uVar94 * 4);
                      auVar187._4_4_ = uVar91;
                      auVar187._0_4_ = uVar91;
                      auVar187._8_4_ = uVar91;
                      auVar187._12_4_ = uVar91;
                      auVar187._16_4_ = uVar91;
                      auVar187._20_4_ = uVar91;
                      auVar187._24_4_ = uVar91;
                      auVar187._28_4_ = uVar91;
                      auVar105 = vcmpps_avx(auVar105,auVar187,1);
                      auVar105 = vandps_avx(auVar165,auVar105);
                      auVar105 = vandps_avx(auVar105,auVar125);
                      auVar103 = vpackssdw_avx(auVar105._0_16_,auVar105._16_16_);
                    }
                    else {
                      auVar103 = vpackssdw_avx(auVar125._0_16_,auVar125._16_16_);
                    }
                    auVar102 = vpackssdw_avx(local_2e20._0_16_,local_2e20._16_16_);
                    auVar103 = vpand_avx(auVar103,auVar102);
                    auVar102 = vpmovzxwd_avx(auVar103);
                    auVar161 = vpslld_avx(auVar102,0x1f);
                    auVar102 = vpunpckhwd_avx(auVar103,auVar103);
                    auVar102 = vpslld_avx(auVar102,0x1f);
                    auVar107._16_16_ = auVar102;
                    auVar107._0_16_ = auVar161;
                    if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar107 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar107 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar107 >> 0x7f,0) == '\0') &&
                          (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB161(auVar102 >> 0x3f,0) == '\0') &&
                        (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar102[0xf]) {
                      auVar105 = vcmpps_avx(ZEXT1632(auVar103),ZEXT1632(auVar103),0xf);
                      auVar132 = ZEXT3264(auVar105);
                      auVar154 = ZEXT3264(auVar154._0_32_);
                    }
                    else {
                      auVar103 = vpunpckhwd_avx(auVar103,auVar103);
                      auVar103 = vpslld_avx(auVar103,0x1f);
                      auVar108._16_16_ = auVar103;
                      auVar108._0_16_ = auVar161;
                      auVar127._8_4_ = 0x7f800000;
                      auVar127._0_8_ = 0x7f8000007f800000;
                      auVar127._12_4_ = 0x7f800000;
                      auVar127._16_4_ = 0x7f800000;
                      auVar127._20_4_ = 0x7f800000;
                      auVar127._24_4_ = 0x7f800000;
                      auVar127._28_4_ = 0x7f800000;
                      auVar105 = vblendvps_avx(auVar127,auVar23,auVar108);
                      if (local_2ee0 != 8) {
                        *puVar92 = local_2ee0;
                        puVar92 = puVar92 + 1;
                        local_2ea0 = auVar154._0_8_;
                        uStack_2e98 = auVar154._8_8_;
                        uStack_2e90 = auVar154._16_8_;
                        uStack_2e88 = auVar154._24_8_;
                        *(undefined1 (*) [8])*pauVar93 = local_2ea0;
                        *(undefined8 *)(*pauVar93 + 8) = uStack_2e98;
                        *(undefined8 *)(*pauVar93 + 0x10) = uStack_2e90;
                        *(undefined8 *)(*pauVar93 + 0x18) = uStack_2e88;
                        pauVar93 = pauVar93 + 1;
                      }
                      auVar154 = ZEXT3264(auVar105);
                      auVar105 = vcmpps_avx(auVar105,auVar105,0xf);
                      auVar132 = ZEXT3264(auVar105);
                      local_2ee0 = uVar84;
                    }
                  }
                } while ((uVar84 != 8) && (bVar100 = uVar94 < 3, uVar94 = uVar94 + 1, bVar100));
                iVar88 = 0;
                if (local_2ee0 == 8) {
LAB_003b3865:
                  bVar100 = false;
                  iVar88 = 4;
                }
                else {
                  auVar105 = vcmpps_avx(local_2980,auVar154._0_32_,6);
                  uVar91 = vmovmskps_avx(auVar105);
                  bVar100 = true;
                  if ((uint)POPCOUNT(uVar91) <= (uint)uVar97) {
                    *puVar92 = local_2ee0;
                    puVar92 = puVar92 + 1;
                    *pauVar93 = auVar154._0_32_;
                    pauVar93 = pauVar93 + 1;
                    goto LAB_003b3865;
                  }
                }
              } while (bVar100);
            }
          }
        }
      } while (iVar88 != 3);
      auVar105 = vandps_avx(local_2840,_local_2e00);
      auVar131._8_4_ = 0xff800000;
      auVar131._0_8_ = 0xff800000ff800000;
      auVar131._12_4_ = 0xff800000;
      auVar131._16_4_ = 0xff800000;
      auVar131._20_4_ = 0xff800000;
      auVar131._24_4_ = 0xff800000;
      auVar131._28_4_ = 0xff800000;
      auVar105 = vmaskmovps_avx(auVar105,auVar131);
      *(undefined1 (*) [32])local_2e58 = auVar105;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }